

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O0

void __thiscall
RasterizerA3<8u>::_renderImpl<CompositorSIMD,false>(RasterizerA3<8u> *this,uint32_t argb32)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  uint7 uVar18;
  uint7 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint32_t *puVar54;
  longlong lVar55;
  longlong lVar56;
  int iVar57;
  ulong uVar58;
  uint32_t uVar59;
  uchar *puVar60;
  intptr_t iVar61;
  unsigned_long uVar62;
  ulong uVar63;
  unsigned_long uVar64;
  unsigned_long uVar65;
  unsigned_long *puVar66;
  long lVar67;
  short sVar68;
  short sVar92;
  ulong uVar74;
  short sVar79;
  short sVar85;
  short sVar98;
  int iVar103;
  short sVar111;
  undefined1 auVar75 [16];
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar106;
  short sVar117;
  ulong uVar104;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar73;
  ushort uVar84;
  ushort uVar90;
  int iVar91;
  ushort uVar97;
  int iVar116;
  ulong uVar105;
  undefined1 auVar78 [16];
  undefined8 local_2cd8;
  undefined8 uStack_2cd0;
  undefined8 local_2c98;
  undefined8 uStack_2c90;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  longlong local_2c58;
  longlong lStack_2c50;
  undefined8 local_2bf8;
  undefined8 uStack_2bf0;
  undefined8 local_2b78;
  undefined8 uStack_2b70;
  undefined8 local_2b58;
  undefined8 uStack_2b50;
  longlong local_2b38;
  longlong lStack_2b30;
  longlong local_2b18;
  longlong lStack_2b10;
  undefined8 local_2a78;
  undefined8 uStack_2a70;
  undefined8 local_2a68;
  undefined8 uStack_2a60;
  undefined8 local_2938;
  undefined8 uStack_2930;
  undefined8 local_28f8;
  undefined8 uStack_28f0;
  undefined8 local_28d8;
  undefined8 uStack_28d0;
  longlong local_28b8;
  longlong lStack_28b0;
  undefined8 local_2858;
  undefined8 uStack_2850;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  longlong local_2798;
  longlong lStack_2790;
  longlong local_2778;
  longlong lStack_2770;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  longlong local_25e8;
  longlong lStack_25e0;
  unsigned_long uStack_25a8;
  uint32_t mask_1;
  unsigned_long local_25a0;
  uint local_2594;
  unsigned_long uStack_2590;
  uint32_t mask;
  size_t x1;
  BitWordFlipIterator<unsigned_long> it;
  size_t xOffset;
  size_t x0;
  long lStack_2560;
  int cover;
  uint32_t *dstPix;
  Cell *cell;
  size_t nBits;
  CompositorSIMD compositor;
  Cell *cellLine;
  BitWord *bitPtr;
  size_t y1;
  size_t y0;
  intptr_t dstStride;
  uint8_t *dstLine;
  uint32_t argb32_local;
  RasterizerA3<8U> *this_local;
  uint32_t index_1;
  unsigned_long bitWord_1;
  uint32_t index;
  unsigned_long bitWord;
  undefined8 uStack_2458;
  I128 s0_7;
  I128 s1_4;
  I128 s0_6;
  I128 s3_1;
  I128 s2_1;
  I128 s1_3;
  I128 s0_5;
  I128 mInv_1;
  I128 mPix_1;
  undefined4 local_23b8;
  short sStack_23a8;
  short sStack_23a6;
  I128 mVal_1;
  size_t i_2;
  size_t local_2380;
  undefined8 uStack_2368;
  I128 s0_2;
  I128 s1_1;
  I128 s0_1;
  I128 s3;
  I128 s2;
  I128 s1;
  I128 s0;
  I128 mInv;
  I128 mPix;
  undefined4 local_22c8;
  short sStack_22b8;
  short sStack_22b6;
  I128 mVal;
  size_t i;
  size_t local_2290;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  longlong *local_1cc0;
  undefined1 *local_1cb8;
  longlong *local_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  longlong *local_1c90;
  undefined1 *local_1c88;
  longlong *local_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  longlong *local_1c60;
  undefined1 *local_1c58;
  longlong *local_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  longlong *local_1c30;
  undefined1 *local_1c28;
  longlong *local_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  longlong *local_1c00;
  undefined1 *local_1bf8;
  longlong *local_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  longlong *local_1bd0;
  undefined1 *local_1bc8;
  longlong *local_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 *local_1ba0;
  undefined1 *local_1b98;
  undefined8 *local_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  longlong *local_1b70;
  undefined1 *local_1b68;
  longlong *local_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  longlong *local_1b40;
  undefined1 *local_1b38;
  longlong *local_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  longlong *local_1b10;
  undefined1 *local_1b08;
  longlong *local_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  longlong *local_1ae0;
  undefined1 *local_1ad8;
  longlong *local_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  longlong *local_1ab0;
  undefined1 *local_1aa8;
  longlong *local_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  longlong *local_1a80;
  undefined1 *local_1a78;
  longlong *local_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 *local_1a58;
  undefined1 *local_1a50;
  undefined8 *local_1a48;
  longlong *local_1a40;
  longlong *local_1a38;
  longlong *local_1a30;
  longlong *local_1a28;
  longlong *local_1a20;
  longlong *local_1a18;
  undefined8 *local_1a10;
  undefined8 *local_1a08;
  longlong *local_1a00;
  longlong *local_19f8;
  longlong *local_19f0;
  longlong *local_19e8;
  longlong *local_19e0;
  longlong *local_19d8;
  undefined8 *local_19d0;
  undefined8 *local_19c8;
  uint *local_19c0;
  undefined1 local_19b8 [16];
  uint local_19a4;
  uint *local_19a0;
  undefined1 local_1998 [16];
  uint local_197c;
  longlong local_1978;
  longlong lStack_1970;
  longlong *local_1960;
  longlong local_1958;
  longlong lStack_1950;
  longlong *local_1940;
  longlong local_1938;
  longlong lStack_1930;
  longlong *local_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 *local_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 *local_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 *local_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 *local_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 *local_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 *local_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 *local_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 *local_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 *local_1800;
  longlong local_17f8;
  longlong lStack_17f0;
  longlong *local_17e0;
  longlong local_17d8;
  longlong lStack_17d0;
  longlong *local_17c0;
  longlong local_17b8;
  longlong lStack_17b0;
  longlong *local_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 *local_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 *local_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 *local_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 *local_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 *local_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 *local_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 *local_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 *local_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 *local_1680;
  undefined8 local_1678;
  longlong lStack_1670;
  undefined8 local_1668;
  longlong lStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  longlong lStack_1630;
  undefined8 local_1628;
  longlong lStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  ulong local_15d8;
  ulong uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  ulong local_15b8;
  ulong uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  ulong local_1598;
  ulong uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  ulong local_1558;
  ulong uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  ulong local_1538;
  ulong uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  ulong local_1518;
  ulong uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  ulong local_14d8;
  ulong uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  ulong local_14b8;
  ulong uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  ulong local_1498;
  ulong uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  ulong local_1458;
  ulong uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  ulong local_1438;
  ulong uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  ulong local_1418;
  ulong uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  short local_13e8;
  short sStack_13e6;
  short sStack_13e4;
  short sStack_13e2;
  short sStack_13e0;
  short sStack_13de;
  short sStack_13dc;
  short sStack_13da;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  short local_13c8;
  short sStack_13c6;
  short sStack_13c4;
  short sStack_13c2;
  short sStack_13c0;
  short sStack_13be;
  short sStack_13bc;
  short sStack_13ba;
  undefined1 (*local_13b8) [16];
  long local_13b0;
  undefined1 (*local_13a8) [16];
  undefined1 (*local_13a0) [16];
  undefined1 (*local_1398) [16];
  long local_1390;
  undefined1 (*local_1388) [16];
  undefined1 (*local_1380) [16];
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined1 *local_ed8;
  undefined8 *local_ed0;
  undefined1 *local_ec8;
  undefined8 *local_ec0;
  undefined1 *local_eb8;
  undefined8 *local_eb0;
  undefined1 *local_ea8;
  undefined8 *local_ea0;
  undefined1 *local_e98;
  undefined8 *local_e90;
  undefined1 *local_e88;
  undefined8 *local_e80;
  undefined1 *local_e78;
  undefined8 *local_e70;
  undefined1 *local_e68;
  undefined8 *local_e60;
  undefined1 *local_e58;
  undefined8 *local_e50;
  undefined1 *local_e48;
  undefined8 *local_e40;
  undefined1 *local_e38;
  undefined8 *local_e30;
  undefined1 *local_e28;
  undefined8 *local_e20;
  undefined1 *local_e18;
  undefined8 *local_e10;
  undefined1 *local_e08;
  undefined8 *local_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  uint local_b30;
  uint local_b2c;
  undefined8 uStack_b28;
  I128 t0_1;
  I128 s0_4;
  I128 m0_1;
  I128 t1;
  I128 t0;
  I128 s1_2;
  I128 s0_3;
  I128 m1;
  I128 m0;
  ulong local_a90;
  size_t i_1;
  I128 coverXmm;
  size_t local_a60;
  ulong local_a28;
  ulong local_9f8;
  short local_8b8;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  short sStack_8b0;
  short sStack_8ae;
  short sStack_8ac;
  short sStack_8aa;
  longlong *local_8a0;
  undefined1 *local_898;
  longlong *local_890;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  longlong *local_870;
  undefined1 *local_868;
  longlong *local_860;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  longlong *local_848;
  undefined1 *local_840;
  longlong *local_838;
  longlong *local_830;
  longlong *local_828;
  longlong *local_820;
  longlong *local_818;
  uint *local_810;
  undefined1 local_808 [16];
  uint local_7f4;
  uint *local_7f0;
  undefined1 local_7e8 [16];
  uint local_7d4;
  uint *local_7d0;
  undefined1 local_7c8 [16];
  uint local_7ac;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  uint32_t *local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  uint32_t *local_770;
  longlong local_768;
  longlong lStack_760;
  longlong *local_750;
  longlong local_748;
  longlong lStack_740;
  longlong local_738;
  longlong lStack_730;
  longlong local_728;
  longlong lStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  longlong local_708;
  longlong lStack_700;
  longlong local_6f8;
  longlong lStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  longlong local_658;
  longlong lStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  longlong local_638;
  longlong lStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  longlong local_618;
  longlong lStack_610;
  uint32_t *local_600;
  uint32_t *local_5f8;
  undefined1 (*local_5f0) [16];
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  longlong local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  longlong local_5a8;
  longlong lStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  longlong local_588;
  longlong lStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  longlong local_568;
  longlong lStack_560;
  longlong local_558;
  longlong lStack_550;
  longlong local_548;
  longlong lStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  longlong local_528;
  longlong lStack_520;
  undefined8 local_518;
  longlong lStack_510;
  longlong local_508;
  longlong lStack_500;
  undefined1 *local_4f8;
  short *local_4f0;
  undefined1 *local_4e8;
  short *local_4e0;
  undefined1 *local_4d8;
  short *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  longlong local_448;
  longlong lStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  longlong *local_420;
  longlong *local_418;
  longlong *local_410;
  longlong *local_408;
  longlong *local_400;
  longlong *local_3f8;
  longlong *local_3f0;
  longlong *local_3e8;
  longlong *local_3e0;
  undefined8 *local_3d8;
  size_t *local_3d0;
  longlong *local_3c8;
  size_t *local_3c0;
  longlong *local_3b8;
  longlong *local_3b0;
  longlong *local_3a8;
  longlong *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  longlong *local_388;
  longlong *local_380;
  longlong *local_378;
  undefined1 *local_370;
  longlong *local_368;
  size_t *local_360;
  longlong *local_358;
  undefined1 *local_350;
  longlong *local_348;
  size_t *local_340;
  longlong *local_338;
  longlong *local_330;
  longlong *local_328;
  longlong *local_320;
  undefined8 *local_318;
  longlong *local_310;
  longlong *local_308;
  longlong *local_300;
  longlong *local_2f8;
  longlong *local_2f0;
  size_t *local_2e8;
  longlong *local_2e0;
  longlong *local_2d8;
  size_t *local_2d0;
  size_t local_2c8;
  longlong lStack_2c0;
  size_t local_2b8;
  longlong lStack_2b0;
  longlong local_2a8;
  int iStack_2a0;
  uint uStack_29c;
  undefined4 local_298;
  undefined4 uStack_294;
  int iStack_290;
  int iStack_28c;
  longlong local_288;
  longlong lStack_280;
  longlong local_278;
  longlong lStack_270;
  longlong local_268;
  longlong lStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  long local_248;
  ulong uStack_240;
  longlong local_238;
  longlong lStack_230;
  undefined8 local_228;
  longlong lStack_220;
  longlong local_218;
  longlong lStack_210;
  longlong local_208;
  longlong lStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  longlong lStack_1d0;
  undefined4 local_1bc;
  undefined8 local_1b8;
  longlong lStack_1b0;
  undefined4 local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  longlong local_188;
  longlong lStack_180;
  size_t local_178;
  longlong lStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  longlong local_148;
  longlong lStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  longlong local_88;
  longlong lStack_80;
  longlong local_78;
  longlong lStack_70;
  undefined1 *local_68;
  longlong *local_60;
  undefined1 *local_58;
  longlong *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  longlong local_38;
  longlong lStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  longlong local_18;
  longlong lStack_10;
  
  puVar60 = Image::data<unsigned_char>(*(Image **)(this + 8));
  iVar61 = Image::stride(*(Image **)(this + 8));
  y1 = (size_t)*(int *)(this + 0x40);
  iVar1 = *(int *)(this + 0x44);
  cellLine = (Cell *)(*(long *)(this + 0x50) + y1 * *(long *)(this + 0x48) * 8);
  compositor._u32[1] = *(long *)(this + 0x60) + y1 * *(long *)(this + 0x58) * 8;
  nBits._0_4_ = PixelUtils::premultiply(argb32);
  auVar75._8_4_ = (uint32_t)nBits;
  auVar75._0_8_ = CONCAT44((uint32_t)nBits,(uint32_t)nBits);
  auVar75._12_4_ = (uint32_t)nBits;
  auVar75 = pmovzxbw(auVar75,CONCAT44((uint32_t)nBits,(uint32_t)nBits));
  local_25e8 = auVar75._0_8_;
  lStack_25e0 = auVar75._8_8_;
  compositor._p32[1] = local_25e8;
  compositor._u32[0] = lStack_25e0;
  dstStride = (intptr_t)(puVar60 + y1 * iVar61);
  nBits._4_4_ = (uint32_t)nBits;
  compositor._p32[0]._0_4_ = (uint32_t)nBits;
  compositor._p32[0]._4_4_ = (uint32_t)nBits;
  do {
    if ((ulong)(long)iVar1 < y1) {
      Bounds::reset((Bounds *)(this + 0x40));
      return;
    }
    cell = *(Cell **)(this + 0x48);
    dstPix = (uint32_t *)compositor._u32[1];
    lStack_2560 = dstStride;
    x0._4_4_ = 0;
    xOffset = 0;
    it._xorMask = 0;
    do {
      x1 = *(size_t *)cellLine;
      it._bitWord = 0;
      cellLine->cover = 0;
      cellLine->area = 0;
      while (uVar65 = it._xorMask, sVar4 = x1, x1 != 0) {
        if (x1 == 0) {
          __assert_fail("bitWord != T(0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/./intutils.h"
                        ,0x151,
                        "size_t IntUtils::BitWordFlipIterator<unsigned long>::nextAndFlip() [T = unsigned long]"
                       );
        }
        uVar59 = IntUtils::ctz<unsigned_long>(x1);
        uVar62 = IntUtils::allOnes<unsigned_long>();
        uVar63 = uVar62 << ((byte)uVar59 & 0x3f) ^ sVar4;
        uVar64 = IntUtils::allOnes<unsigned_long>();
        uVar62 = it._xorMask;
        it._bitWord = uVar64 ^ it._bitWord;
        uStack_2590 = uVar65 + (ulong)uVar59 * 8;
        sVar4 = xOffset;
        uVar58 = local_1478;
        uVar105 = uStack_1470;
        if (xOffset < uStack_2590) {
          local_b2c = x0._4_4_ & 0x1ff;
          if (0xff < local_b2c) {
            local_b2c = 0x1ff - local_b2c;
          }
          local_2594 = local_b2c;
          sVar4 = uStack_2590;
          if (local_b2c != 0) {
            local_2290 = xOffset;
            mVal[1] = uStack_2590 - xOffset >> 2;
            if (local_b2c == 0xff) {
              for (; 7 < (ulong)mVal[1]; mVal[1] = mVal[1] + -8) {
                local_1760 = (undefined8 *)(lStack_2560 + local_2290 * 4);
                local_1778 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_1770 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_1760 = local_1778;
                local_1760[1] = uStack_1770;
                lVar67 = lStack_2560 + local_2290 * 4;
                local_1740 = (undefined8 *)(lVar67 + 0x10);
                local_1758 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_1750 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_1740 = local_1758;
                *(undefined8 *)(lVar67 + 0x18) = uStack_1750;
                lVar67 = lStack_2560 + local_2290 * 4;
                local_1720 = (undefined8 *)(lVar67 + 0x20);
                local_1738 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_1730 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_1720 = local_1738;
                *(undefined8 *)(lVar67 + 0x28) = uStack_1730;
                lVar67 = lStack_2560 + local_2290 * 4;
                local_1700 = (undefined8 *)(lVar67 + 0x30);
                local_1718 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_1710 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_1700 = local_1718;
                *(undefined8 *)(lVar67 + 0x38) = uStack_1710;
                lVar67 = lStack_2560 + local_2290 * 4;
                local_16e0 = (undefined8 *)(lVar67 + 0x40);
                local_16f8 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_16f0 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_16e0 = local_16f8;
                *(undefined8 *)(lVar67 + 0x48) = uStack_16f0;
                lVar67 = lStack_2560 + local_2290 * 4;
                local_16c0 = (undefined8 *)(lVar67 + 0x50);
                local_16d8 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_16d0 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_16c0 = local_16d8;
                *(undefined8 *)(lVar67 + 0x58) = uStack_16d0;
                lVar67 = lStack_2560 + local_2290 * 4;
                local_16a0 = (undefined8 *)(lVar67 + 0x60);
                local_16b8 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_16b0 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_16a0 = local_16b8;
                *(undefined8 *)(lVar67 + 0x68) = uStack_16b0;
                lVar67 = lStack_2560 + local_2290 * 4;
                local_1680 = (undefined8 *)(lVar67 + 0x70);
                local_1698 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_1690 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_1680 = local_1698;
                *(undefined8 *)(lVar67 + 0x78) = uStack_1690;
                local_2290 = local_2290 + 0x20;
              }
              for (; mVal[1] != 0; mVal[1] = mVal[1] + -1) {
                local_1780 = (undefined8 *)(lStack_2560 + local_2290 * 4);
                local_1798 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_1790 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *local_1780 = local_1798;
                local_1780[1] = uStack_1790;
                local_2290 = local_2290 + 4;
              }
              for (; sVar4 = uStack_2590, local_2290 < uStack_2590; local_2290 = local_2290 + 1) {
                local_1618 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
                uStack_1610 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
                *(uint32_t *)(lStack_2560 + local_2290 * 4) = (uint32_t)nBits;
                local_1608 = local_1618;
                uStack_1600 = uStack_1610;
              }
            }
            else {
              auVar75 = pshuflw(ZEXT416(local_b2c),ZEXT416(local_b2c),0);
              local_22c8 = auVar75._0_4_;
              sStack_22b8 = auVar75._0_2_;
              sStack_22b6 = auVar75._2_2_;
              local_14f8 = CONCAT26(sStack_22b6,CONCAT24(sStack_22b8,local_22c8));
              uStack_14f0 = CONCAT26(sStack_22b6,CONCAT24(sStack_22b8,local_22c8));
              local_14e8._0_2_ = (short)compositor._p32[1];
              local_14e8._2_2_ = (short)((ulong)compositor._p32[1] >> 0x10);
              local_14e8._4_2_ = (short)((ulong)compositor._p32[1] >> 0x20);
              local_14e8._6_2_ = (short)((ulong)compositor._p32[1] >> 0x30);
              uStack_14e0._0_2_ = (short)compositor._u32[0];
              uStack_14e0._2_2_ = (short)((ulong)compositor._u32[0] >> 0x10);
              uStack_14e0._4_2_ = (short)((ulong)compositor._u32[0] >> 0x20);
              uStack_14e0._6_2_ = (short)((ulong)compositor._u32[0] >> 0x30);
              sVar68 = (short)local_14e8 * sStack_22b8;
              sVar79 = local_14e8._2_2_ * sStack_22b6;
              sVar85 = local_14e8._4_2_ * sStack_22b8;
              sVar92 = local_14e8._6_2_ * sStack_22b6;
              sVar98 = (short)uStack_14e0 * sStack_22b8;
              sVar106 = uStack_14e0._2_2_ * sStack_22b6;
              sVar111 = uStack_14e0._4_2_ * sStack_22b8;
              sVar117 = uStack_14e0._6_2_ * sStack_22b6;
              uVar16 = CONCAT26(sVar92,CONCAT24(sVar85,CONCAT22(sVar79,sVar68)));
              uVar20 = CONCAT26(sVar117,CONCAT24(sVar111,CONCAT22(sVar106,sVar98)));
              local_13c8 = sStack_22b8;
              sStack_13c6 = sStack_22b6;
              sStack_13c4 = sStack_22b8;
              sStack_13c2 = sStack_22b6;
              sStack_13c0 = sStack_22b8;
              sStack_13be = sStack_22b6;
              sStack_13bc = sStack_22b8;
              sStack_13ba = sStack_22b6;
              local_13d8 = 0xff00ff00ff00ff;
              uStack_13d0 = 0xff00ff00ff00ff;
              uVar74 = CONCAT26(sStack_22b6,CONCAT24(sStack_22b8,local_22c8)) ^ 0xff00ff00ff00ff;
              uVar104 = CONCAT26(sStack_22b6,CONCAT24(sStack_22b8,local_22c8)) ^ 0xff00ff00ff00ff;
              while( true ) {
                uVar105 = uStack_1470;
                uVar58 = local_1478;
                local_1478._0_2_ = (short)uVar74;
                local_1478._2_2_ = (short)(uVar74 >> 0x10);
                local_1478._4_2_ = (short)(uVar74 >> 0x20);
                local_1478._6_2_ = (short)(uVar74 >> 0x30);
                uStack_1470._0_2_ = (short)uVar104;
                uStack_1470._2_2_ = (short)(uVar104 >> 0x10);
                uStack_1470._4_2_ = (short)(uVar104 >> 0x20);
                uStack_1470._6_2_ = (short)(uVar104 >> 0x30);
                if ((ulong)mVal[1] < 2) break;
                local_1388 = (undefined1 (*) [16])(lStack_2560 + local_2290 * 4);
                local_12e8 = *(undefined8 *)*local_1388;
                uVar2 = *(undefined8 *)(*local_1388 + 8);
                lVar67 = lStack_2560 + local_2290 * 4;
                local_1380 = (undefined1 (*) [16])(lVar67 + 0x10);
                local_12c8 = *(undefined8 *)*local_1380;
                uVar3 = *(undefined8 *)(lVar67 + 0x18);
                local_1278 = 0;
                uStack_1270 = 0;
                local_12f8 = 0;
                uStack_12f0 = 0;
                uStack_12e0._0_1_ = (byte)uVar2;
                uStack_12e0._1_1_ = (byte)((ulong)uVar2 >> 8);
                uStack_12e0._2_1_ = (byte)((ulong)uVar2 >> 0x10);
                uStack_12e0._3_1_ = (byte)((ulong)uVar2 >> 0x18);
                uStack_12e0._4_1_ = (byte)((ulong)uVar2 >> 0x20);
                uStack_12e0._5_1_ = (byte)((ulong)uVar2 >> 0x28);
                uStack_12e0._6_1_ = (byte)((ulong)uVar2 >> 0x30);
                uStack_12e0._7_1_ = (byte)((ulong)uVar2 >> 0x38);
                local_1268 = 0;
                uStack_1260 = 0;
                local_12d8 = 0;
                uStack_12d0 = 0;
                uStack_12c0._0_1_ = (byte)uVar3;
                uStack_12c0._1_1_ = (byte)((ulong)uVar3 >> 8);
                uStack_12c0._2_1_ = (byte)((ulong)uVar3 >> 0x10);
                uStack_12c0._3_1_ = (byte)((ulong)uVar3 >> 0x18);
                uStack_12c0._4_1_ = (byte)((ulong)uVar3 >> 0x20);
                uStack_12c0._5_1_ = (byte)((ulong)uVar3 >> 0x28);
                uStack_12c0._6_1_ = (byte)((ulong)uVar3 >> 0x30);
                uStack_12c0._7_1_ = (byte)((ulong)uVar3 >> 0x38);
                auVar75 = pmovzxbw(*local_1388,local_12e8);
                local_26c8 = auVar75._0_8_;
                uStack_26c0 = auVar75._8_8_;
                auVar78 = pmovzxbw(*local_1380,local_12c8);
                local_26d8 = auVar78._0_8_;
                uStack_26d0 = auVar78._8_8_;
                local_1468._2_2_ = (ushort)uStack_12e0._1_1_;
                local_1468._4_2_ = (ushort)uStack_12e0._2_1_;
                local_1468._6_2_ = (ushort)uStack_12e0._3_1_;
                uStack_1460._2_2_ = (ushort)uStack_12e0._5_1_;
                uStack_1460._4_2_ = (ushort)uStack_12e0._6_1_;
                uStack_1460._6_2_ = (ushort)uStack_12e0._7_1_;
                sVar69 = (ushort)(byte)uStack_12e0 * (short)local_1478;
                sVar99 = (ushort)uStack_12e0._4_1_ * (short)uStack_1470;
                local_f48 = CONCAT26(local_1468._6_2_ * local_1478._6_2_,
                                     CONCAT24(local_1468._4_2_ * local_1478._4_2_,
                                              CONCAT22(local_1468._2_2_ * local_1478._2_2_,sVar69)))
                ;
                uStack_f40 = CONCAT26(uStack_1460._6_2_ * uStack_1470._6_2_,
                                      CONCAT24(uStack_1460._4_2_ * uStack_1470._4_2_,
                                               CONCAT22(uStack_1460._2_2_ * uStack_1470._2_2_,sVar99
                                                       )));
                local_1448._2_2_ = (ushort)uStack_12c0._1_1_;
                local_1448._4_2_ = (ushort)uStack_12c0._2_1_;
                local_1448._6_2_ = (ushort)uStack_12c0._3_1_;
                uStack_1440._2_2_ = (ushort)uStack_12c0._5_1_;
                uStack_1440._4_2_ = (ushort)uStack_12c0._6_1_;
                uStack_1440._6_2_ = (ushort)uStack_12c0._7_1_;
                sVar70 = (ushort)(byte)uStack_12c0 * (short)local_1478;
                sVar100 = (ushort)uStack_12c0._4_1_ * (short)uStack_1470;
                local_f28 = CONCAT26(local_1448._6_2_ * local_1478._6_2_,
                                     CONCAT24(local_1448._4_2_ * local_1478._4_2_,
                                              CONCAT22(local_1448._2_2_ * local_1478._2_2_,sVar70)))
                ;
                uStack_f20 = CONCAT26(uStack_1440._6_2_ * uStack_1470._6_2_,
                                      CONCAT24(uStack_1440._4_2_ * uStack_1470._4_2_,
                                               CONCAT22(uStack_1440._2_2_ * uStack_1470._2_2_,
                                                        sVar100)));
                local_1428._0_2_ = auVar75._0_2_;
                local_1428._2_2_ = auVar75._2_2_;
                local_1428._4_2_ = auVar75._4_2_;
                local_1428._6_2_ = auVar75._6_2_;
                uStack_1420._0_2_ = auVar75._8_2_;
                uStack_1420._2_2_ = auVar75._10_2_;
                uStack_1420._4_2_ = auVar75._12_2_;
                uStack_1420._6_2_ = auVar75._14_2_;
                local_f08 = CONCAT26(local_1428._6_2_ * local_1478._6_2_,
                                     CONCAT24(local_1428._4_2_ * local_1478._4_2_,
                                              CONCAT22(local_1428._2_2_ * local_1478._2_2_,
                                                       (short)local_1428 * (short)local_1478)));
                uStack_f00 = CONCAT26(uStack_1420._6_2_ * uStack_1470._6_2_,
                                      CONCAT24(uStack_1420._4_2_ * uStack_1470._4_2_,
                                               CONCAT22(uStack_1420._2_2_ * uStack_1470._2_2_,
                                                        (short)uStack_1420 * (short)uStack_1470)));
                local_1408._0_2_ = auVar78._0_2_;
                local_1408._2_2_ = auVar78._2_2_;
                local_1408._4_2_ = auVar78._4_2_;
                local_1408._6_2_ = auVar78._6_2_;
                uStack_1400._0_2_ = auVar78._8_2_;
                uStack_1400._2_2_ = auVar78._10_2_;
                uStack_1400._4_2_ = auVar78._12_2_;
                uStack_1400._6_2_ = auVar78._14_2_;
                local_ee8 = CONCAT26(local_1408._6_2_ * local_1478._6_2_,
                                     CONCAT24(local_1408._4_2_ * local_1478._4_2_,
                                              CONCAT22(local_1408._2_2_ * local_1478._2_2_,
                                                       (short)local_1408 * (short)local_1478)));
                uStack_ee0 = CONCAT26(uStack_1400._6_2_ * uStack_1470._6_2_,
                                      CONCAT24(uStack_1400._4_2_ * uStack_1470._4_2_,
                                               CONCAT22(uStack_1400._2_2_ * uStack_1470._2_2_,
                                                        (short)uStack_1400 * (short)uStack_1470)));
                sVar69 = sVar69 + sVar68;
                sVar80 = local_1468._2_2_ * local_1478._2_2_ + sVar79;
                sVar86 = local_1468._4_2_ * local_1478._4_2_ + sVar85;
                sVar93 = local_1468._6_2_ * local_1478._6_2_ + sVar92;
                sVar99 = sVar99 + sVar98;
                sVar107 = uStack_1460._2_2_ * uStack_1470._2_2_ + sVar106;
                sVar112 = uStack_1460._4_2_ * uStack_1470._4_2_ + sVar111;
                sVar118 = uStack_1460._6_2_ * uStack_1470._6_2_ + sVar117;
                local_1108 = CONCAT26(sVar93,CONCAT24(sVar86,CONCAT22(sVar80,sVar69)));
                uStack_1100 = CONCAT26(sVar118,CONCAT24(sVar112,CONCAT22(sVar107,sVar99)));
                sVar70 = sVar70 + sVar68;
                sVar81 = local_1448._2_2_ * local_1478._2_2_ + sVar79;
                sVar87 = local_1448._4_2_ * local_1478._4_2_ + sVar85;
                sVar94 = local_1448._6_2_ * local_1478._6_2_ + sVar92;
                sVar100 = sVar100 + sVar98;
                sVar108 = uStack_1440._2_2_ * uStack_1470._2_2_ + sVar106;
                sVar113 = uStack_1440._4_2_ * uStack_1470._4_2_ + sVar111;
                sVar119 = uStack_1440._6_2_ * uStack_1470._6_2_ + sVar117;
                local_10e8 = CONCAT26(sVar94,CONCAT24(sVar87,CONCAT22(sVar81,sVar70)));
                uStack_10e0 = CONCAT26(sVar119,CONCAT24(sVar113,CONCAT22(sVar108,sVar100)));
                sVar71 = (short)local_1428 * (short)local_1478 + sVar68;
                sVar82 = local_1428._2_2_ * local_1478._2_2_ + sVar79;
                sVar88 = local_1428._4_2_ * local_1478._4_2_ + sVar85;
                sVar95 = local_1428._6_2_ * local_1478._6_2_ + sVar92;
                sVar101 = (short)uStack_1420 * (short)uStack_1470 + sVar98;
                sVar109 = uStack_1420._2_2_ * uStack_1470._2_2_ + sVar106;
                sVar114 = uStack_1420._4_2_ * uStack_1470._4_2_ + sVar111;
                sVar120 = uStack_1420._6_2_ * uStack_1470._6_2_ + sVar117;
                local_10c8 = CONCAT26(sVar95,CONCAT24(sVar88,CONCAT22(sVar82,sVar71)));
                uStack_10c0 = CONCAT26(sVar120,CONCAT24(sVar114,CONCAT22(sVar109,sVar101)));
                sVar72 = (short)local_1408 * (short)local_1478 + sVar68;
                sVar83 = local_1408._2_2_ * local_1478._2_2_ + sVar79;
                sVar89 = local_1408._4_2_ * local_1478._4_2_ + sVar85;
                sVar96 = local_1408._6_2_ * local_1478._6_2_ + sVar92;
                sVar102 = (short)uStack_1400 * (short)uStack_1470 + sVar98;
                sVar110 = uStack_1400._2_2_ * uStack_1470._2_2_ + sVar106;
                sVar115 = uStack_1400._4_2_ * uStack_1470._4_2_ + sVar111;
                sVar121 = uStack_1400._6_2_ * uStack_1470._6_2_ + sVar117;
                local_10a8 = CONCAT26(sVar96,CONCAT24(sVar89,CONCAT22(sVar83,sVar72)));
                uStack_10a0 = CONCAT26(sVar121,CONCAT24(sVar115,CONCAT22(sVar110,sVar102)));
                local_1c30 = s2 + 1;
                local_1c28 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_1118 = 0x80008000800080;
                uStack_1110 = 0x80008000800080;
                local_1c48 = CONCAT26(sVar93 + 0x80,
                                      CONCAT24(sVar86 + 0x80,CONCAT22(sVar80 + 0x80,sVar69 + 0x80)))
                ;
                uStack_1c40 = CONCAT26(sVar118 + 0x80,
                                       CONCAT24(sVar112 + 0x80,
                                                CONCAT22(sVar107 + 0x80,sVar99 + 0x80)));
                local_e30 = &local_1c48;
                local_e38 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar41._8_8_ = uStack_1c40;
                auVar41._0_8_ = local_1c48;
                local_d98 = 0x101010101010101;
                uStack_d90 = 0x101010101010101;
                auVar24._8_8_ = 0x101010101010101;
                auVar24._0_8_ = 0x101010101010101;
                auVar75 = pmulhuw(auVar41,auVar24);
                local_2778 = auVar75._0_8_;
                s2[1] = local_2778;
                lStack_2770 = auVar75._8_8_;
                s1[0] = lStack_2770;
                local_1c60 = s0_1 + 1;
                local_1c58 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_10f8 = 0x80008000800080;
                uStack_10f0 = 0x80008000800080;
                local_1c78 = CONCAT26(sVar94 + 0x80,
                                      CONCAT24(sVar87 + 0x80,CONCAT22(sVar81 + 0x80,sVar70 + 0x80)))
                ;
                uStack_1c70 = CONCAT26(sVar119 + 0x80,
                                       CONCAT24(sVar113 + 0x80,
                                                CONCAT22(sVar108 + 0x80,sVar100 + 0x80)));
                local_e20 = &local_1c78;
                local_e28 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar40._8_8_ = uStack_1c70;
                auVar40._0_8_ = local_1c78;
                local_db8 = 0x101010101010101;
                uStack_db0 = 0x101010101010101;
                auVar23._8_8_ = 0x101010101010101;
                auVar23._0_8_ = 0x101010101010101;
                auVar78 = pmulhuw(auVar40,auVar23);
                local_2798 = auVar78._0_8_;
                s0_1[1] = local_2798;
                lStack_2790 = auVar78._8_8_;
                s3[0] = lStack_2790;
                local_1c90 = s1 + 1;
                local_1c88 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_10d8 = 0x80008000800080;
                uStack_10d0 = 0x80008000800080;
                local_1ca8 = CONCAT26(sVar95 + 0x80,
                                      CONCAT24(sVar88 + 0x80,CONCAT22(sVar82 + 0x80,sVar71 + 0x80)))
                ;
                uStack_1ca0 = CONCAT26(sVar120 + 0x80,
                                       CONCAT24(sVar114 + 0x80,
                                                CONCAT22(sVar109 + 0x80,sVar101 + 0x80)));
                local_e10 = &local_1ca8;
                local_e18 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar39._8_8_ = uStack_1ca0;
                auVar39._0_8_ = local_1ca8;
                local_dd8 = 0x101010101010101;
                uStack_dd0 = 0x101010101010101;
                auVar22._8_8_ = 0x101010101010101;
                auVar22._0_8_ = 0x101010101010101;
                auVar76 = pmulhuw(auVar39,auVar22);
                local_27b8 = auVar76._0_8_;
                uStack_27b0 = auVar76._8_8_;
                local_1cc0 = s3 + 1;
                local_1cb8 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_10b8 = 0x80008000800080;
                uStack_10b0 = 0x80008000800080;
                local_1cd8 = CONCAT26(sVar96 + 0x80,
                                      CONCAT24(sVar89 + 0x80,CONCAT22(sVar83 + 0x80,sVar72 + 0x80)))
                ;
                uStack_1cd0 = CONCAT26(sVar121 + 0x80,
                                       CONCAT24(sVar115 + 0x80,
                                                CONCAT22(sVar110 + 0x80,sVar102 + 0x80)));
                local_e00 = &local_1cd8;
                local_e08 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar38._8_8_ = uStack_1cd0;
                auVar38._0_8_ = local_1cd8;
                local_df8 = 0x101010101010101;
                uStack_df0 = 0x101010101010101;
                auVar21._8_8_ = 0x101010101010101;
                auVar21._0_8_ = 0x101010101010101;
                auVar77 = pmulhuw(auVar38,auVar21);
                local_27d8 = auVar77._0_8_;
                uStack_27d0 = auVar77._8_8_;
                local_1a28 = s1 + 1;
                local_1a30 = s2 + 1;
                local_b68._0_2_ = auVar76._0_2_;
                local_b68._2_2_ = auVar76._2_2_;
                local_b68._4_2_ = auVar76._4_2_;
                local_b68._6_2_ = auVar76._6_2_;
                uStack_b60._0_2_ = auVar76._8_2_;
                uStack_b60._2_2_ = auVar76._10_2_;
                uStack_b60._4_2_ = auVar76._12_2_;
                uStack_b60._6_2_ = auVar76._14_2_;
                local_b78._0_2_ = auVar75._0_2_;
                local_b78._2_2_ = auVar75._2_2_;
                local_b78._4_2_ = auVar75._4_2_;
                local_b78._6_2_ = auVar75._6_2_;
                uStack_b70._0_2_ = auVar75._8_2_;
                uStack_b70._2_2_ = auVar75._10_2_;
                uStack_b70._4_2_ = auVar75._12_2_;
                uStack_b70._6_2_ = auVar75._14_2_;
                s1[1] = CONCAT17((0 < uStack_b60._6_2_) * (uStack_b60._6_2_ < 0x100) * auVar76[0xe]
                                 - (0xff < uStack_b60._6_2_),
                                 CONCAT16((0 < uStack_b60._4_2_) * (uStack_b60._4_2_ < 0x100) *
                                          auVar76[0xc] - (0xff < uStack_b60._4_2_),
                                          CONCAT15((0 < uStack_b60._2_2_) *
                                                   (uStack_b60._2_2_ < 0x100) * auVar76[10] -
                                                   (0xff < uStack_b60._2_2_),
                                                   CONCAT14((0 < (short)uStack_b60) *
                                                            ((short)uStack_b60 < 0x100) * auVar76[8]
                                                            - (0xff < (short)uStack_b60),
                                                            CONCAT13((0 < local_b68._6_2_) *
                                                                     (local_b68._6_2_ < 0x100) *
                                                                     auVar76[6] -
                                                                     (0xff < local_b68._6_2_),
                                                                     CONCAT12((0 < local_b68._4_2_)
                                                                              * (local_b68._4_2_ <
                                                                                0x100) * auVar76[4]
                                                                              - (0xff < local_b68.
                                                                                        _4_2_),
                                                                              CONCAT11((0 < 
                                                  local_b68._2_2_) * (local_b68._2_2_ < 0x100) *
                                                  auVar76[2] - (0xff < local_b68._2_2_),
                                                  (0 < (short)local_b68) *
                                                  ((short)local_b68 < 0x100) * auVar76[0] -
                                                  (0xff < (short)local_b68))))))));
                lStack_17d0 = CONCAT17((0 < uStack_b70._6_2_) * (uStack_b70._6_2_ < 0x100) *
                                       auVar75[0xe] - (0xff < uStack_b70._6_2_),
                                       CONCAT16((0 < uStack_b70._4_2_) * (uStack_b70._4_2_ < 0x100)
                                                * auVar75[0xc] - (0xff < uStack_b70._4_2_),
                                                CONCAT15((0 < uStack_b70._2_2_) *
                                                         (uStack_b70._2_2_ < 0x100) * auVar75[10] -
                                                         (0xff < uStack_b70._2_2_),
                                                         CONCAT14((0 < (short)uStack_b70) *
                                                                  ((short)uStack_b70 < 0x100) *
                                                                  auVar75[8] -
                                                                  (0xff < (short)uStack_b70),
                                                                  CONCAT13((0 < local_b78._6_2_) *
                                                                           (local_b78._6_2_ < 0x100)
                                                                           * auVar75[6] -
                                                                           (0xff < local_b78._6_2_),
                                                                           CONCAT12((0 < local_b78.
                                                                                         _4_2_) *
                                                                                    (local_b78._4_2_
                                                                                    < 0x100) *
                                                                                    auVar75[4] -
                                                                                    (0xff < 
                                                  local_b78._4_2_),
                                                  CONCAT11((0 < local_b78._2_2_) *
                                                           (local_b78._2_2_ < 0x100) * auVar75[2] -
                                                           (0xff < local_b78._2_2_),
                                                           (0 < (short)local_b78) *
                                                           ((short)local_b78 < 0x100) * auVar75[0] -
                                                           (0xff < (short)local_b78))))))));
                local_1a38 = s3 + 1;
                local_1a40 = s0_1 + 1;
                local_b48._0_2_ = auVar77._0_2_;
                local_b48._2_2_ = auVar77._2_2_;
                local_b48._4_2_ = auVar77._4_2_;
                local_b48._6_2_ = auVar77._6_2_;
                uStack_b40._0_2_ = auVar77._8_2_;
                uStack_b40._2_2_ = auVar77._10_2_;
                uStack_b40._4_2_ = auVar77._12_2_;
                uStack_b40._6_2_ = auVar77._14_2_;
                local_b58._0_2_ = auVar78._0_2_;
                local_b58._2_2_ = auVar78._2_2_;
                local_b58._4_2_ = auVar78._4_2_;
                local_b58._6_2_ = auVar78._6_2_;
                uStack_b50._0_2_ = auVar78._8_2_;
                uStack_b50._2_2_ = auVar78._10_2_;
                uStack_b50._4_2_ = auVar78._12_2_;
                uStack_b50._6_2_ = auVar78._14_2_;
                s3[1] = CONCAT17((0 < uStack_b40._6_2_) * (uStack_b40._6_2_ < 0x100) * auVar77[0xe]
                                 - (0xff < uStack_b40._6_2_),
                                 CONCAT16((0 < uStack_b40._4_2_) * (uStack_b40._4_2_ < 0x100) *
                                          auVar77[0xc] - (0xff < uStack_b40._4_2_),
                                          CONCAT15((0 < uStack_b40._2_2_) *
                                                   (uStack_b40._2_2_ < 0x100) * auVar77[10] -
                                                   (0xff < uStack_b40._2_2_),
                                                   CONCAT14((0 < (short)uStack_b40) *
                                                            ((short)uStack_b40 < 0x100) * auVar77[8]
                                                            - (0xff < (short)uStack_b40),
                                                            CONCAT13((0 < local_b48._6_2_) *
                                                                     (local_b48._6_2_ < 0x100) *
                                                                     auVar77[6] -
                                                                     (0xff < local_b48._6_2_),
                                                                     CONCAT12((0 < local_b48._4_2_)
                                                                              * (local_b48._4_2_ <
                                                                                0x100) * auVar77[4]
                                                                              - (0xff < local_b48.
                                                                                        _4_2_),
                                                                              CONCAT11((0 < 
                                                  local_b48._2_2_) * (local_b48._2_2_ < 0x100) *
                                                  auVar77[2] - (0xff < local_b48._2_2_),
                                                  (0 < (short)local_b48) *
                                                  ((short)local_b48 < 0x100) * auVar77[0] -
                                                  (0xff < (short)local_b48))))))));
                s2[0] = CONCAT17((0 < uStack_b50._6_2_) * (uStack_b50._6_2_ < 0x100) * auVar78[0xe]
                                 - (0xff < uStack_b50._6_2_),
                                 CONCAT16((0 < uStack_b50._4_2_) * (uStack_b50._4_2_ < 0x100) *
                                          auVar78[0xc] - (0xff < uStack_b50._4_2_),
                                          CONCAT15((0 < uStack_b50._2_2_) *
                                                   (uStack_b50._2_2_ < 0x100) * auVar78[10] -
                                                   (0xff < uStack_b50._2_2_),
                                                   CONCAT14((0 < (short)uStack_b50) *
                                                            ((short)uStack_b50 < 0x100) * auVar78[8]
                                                            - (0xff < (short)uStack_b50),
                                                            CONCAT13((0 < local_b58._6_2_) *
                                                                     (local_b58._6_2_ < 0x100) *
                                                                     auVar78[6] -
                                                                     (0xff < local_b58._6_2_),
                                                                     CONCAT12((0 < local_b58._4_2_)
                                                                              * (local_b58._4_2_ <
                                                                                0x100) * auVar78[4]
                                                                              - (0xff < local_b58.
                                                                                        _4_2_),
                                                                              CONCAT11((0 < 
                                                  local_b58._2_2_) * (local_b58._2_2_ < 0x100) *
                                                  auVar78[2] - (0xff < local_b58._2_2_),
                                                  (0 < (short)local_b58) *
                                                  ((short)local_b58 < 0x100) * auVar78[0] -
                                                  (0xff < (short)local_b58))))))));
                local_17c0 = (longlong *)(lStack_2560 + local_2290 * 4);
                *local_17c0 = s1[1];
                local_17c0[1] = lStack_17d0;
                lVar67 = lStack_2560 + local_2290 * 4;
                local_17a0 = (longlong *)(lVar67 + 0x10);
                *local_17a0 = s3[1];
                *(longlong *)(lVar67 + 0x18) = s2[0];
                local_2290 = local_2290 + 8;
                mVal[1] = mVal[1] + -2;
                local_1cb0 = local_1cc0;
                local_1c80 = local_1c90;
                local_1c50 = local_1c60;
                local_1c20 = local_1c30;
                local_17d8 = s1[1];
                local_17b8 = s3[1];
                lStack_17b0 = s2[0];
                local_1478 = uVar74;
                uStack_1470 = uVar104;
                local_1468 = (ulong)CONCAT16(uStack_12e0._3_1_,
                                             (uint6)CONCAT14(uStack_12e0._2_1_,
                                                             (uint)CONCAT12(uStack_12e0._1_1_,
                                                                            (ushort)(byte)
                                                  uStack_12e0)));
                uStack_1460 = (ulong)CONCAT16(uStack_12e0._7_1_,
                                              (uint6)CONCAT14(uStack_12e0._6_1_,
                                                              (uint)CONCAT12(uStack_12e0._5_1_,
                                                                             (ushort)uStack_12e0.
                                                                                     _4_1_)));
                local_1458 = uVar74;
                uStack_1450 = uVar104;
                local_1448 = (ulong)CONCAT16(uStack_12c0._3_1_,
                                             (uint6)CONCAT14(uStack_12c0._2_1_,
                                                             (uint)CONCAT12(uStack_12c0._1_1_,
                                                                            (ushort)(byte)
                                                  uStack_12c0)));
                uStack_1440 = (ulong)CONCAT16(uStack_12c0._7_1_,
                                              (uint6)CONCAT14(uStack_12c0._6_1_,
                                                              (uint)CONCAT12(uStack_12c0._5_1_,
                                                                             (ushort)uStack_12c0.
                                                                                     _4_1_)));
                local_1438 = uVar74;
                uStack_1430 = uVar104;
                local_1428 = local_26c8;
                uStack_1420 = uStack_26c0;
                local_1418 = uVar74;
                uStack_1410 = uVar104;
                local_1408 = local_26d8;
                uStack_1400 = uStack_26d0;
                uStack_12e0 = uVar2;
                uStack_12c0 = uVar3;
                local_f58 = uVar16;
                uStack_f50 = uVar20;
                local_f38 = uVar16;
                uStack_f30 = uVar20;
                local_f18 = uVar16;
                uStack_f10 = uVar20;
                local_ef8 = uVar16;
                uStack_ef0 = uVar20;
                local_de8 = local_1cd8;
                uStack_de0 = uStack_1cd0;
                local_dc8 = local_1ca8;
                uStack_dc0 = uStack_1ca0;
                local_da8 = local_1c78;
                uStack_da0 = uStack_1c70;
                local_d88 = local_1c48;
                uStack_d80 = uStack_1c40;
                local_b78 = local_2778;
                uStack_b70 = lStack_2770;
                local_b68 = local_27b8;
                uStack_b60 = uStack_27b0;
                local_b58 = local_2798;
                uStack_b50 = lStack_2790;
                local_b48 = local_27d8;
                uStack_b40 = uStack_27d0;
              }
              if (mVal[1] != 0) {
                local_1398 = (undefined1 (*) [16])(lStack_2560 + local_2290 * 4);
                local_1308 = *(undefined8 *)*local_1398;
                uVar2 = *(undefined8 *)(*local_1398 + 8);
                local_1390 = lStack_2560 + local_2290 * 4 + 0x10;
                local_1288 = 0;
                uStack_1280 = 0;
                local_1318 = 0;
                uStack_1310 = 0;
                uStack_1300._0_1_ = (byte)uVar2;
                uStack_1300._1_1_ = (byte)((ulong)uVar2 >> 8);
                uStack_1300._2_1_ = (byte)((ulong)uVar2 >> 0x10);
                uStack_1300._3_1_ = (byte)((ulong)uVar2 >> 0x18);
                uStack_1300._4_1_ = (byte)((ulong)uVar2 >> 0x20);
                uStack_1300._5_1_ = (byte)((ulong)uVar2 >> 0x28);
                uStack_1300._6_1_ = (byte)((ulong)uVar2 >> 0x30);
                uStack_1300._7_1_ = (byte)((ulong)uVar2 >> 0x38);
                uVar18 = CONCAT16(uStack_1300._3_1_,
                                  (uint6)CONCAT14(uStack_1300._2_1_,
                                                  (uint)CONCAT12(uStack_1300._1_1_,
                                                                 (ushort)(byte)uStack_1300)));
                uVar19 = CONCAT16(uStack_1300._7_1_,
                                  (uint6)CONCAT14(uStack_1300._6_1_,
                                                  (uint)CONCAT12(uStack_1300._5_1_,
                                                                 (ushort)uStack_1300._4_1_)));
                auVar75 = pmovzxbw(*local_1398,local_1308);
                local_2858 = auVar75._0_8_;
                uStack_2850 = auVar75._8_8_;
                local_14a8._2_2_ = (ushort)uStack_1300._1_1_;
                local_14a8._4_2_ = (ushort)uStack_1300._2_1_;
                local_14a8._6_2_ = (ushort)uStack_1300._3_1_;
                uStack_14a0._2_2_ = (ushort)uStack_1300._5_1_;
                uStack_14a0._4_2_ = (ushort)uStack_1300._6_1_;
                uStack_14a0._6_2_ = (ushort)uStack_1300._7_1_;
                sVar69 = (ushort)(byte)uStack_1300 * (short)local_1478;
                sVar86 = (ushort)uStack_1300._4_1_ * (short)uStack_1470;
                local_f88 = CONCAT26(local_14a8._6_2_ * local_1478._6_2_,
                                     CONCAT24(local_14a8._4_2_ * local_1478._4_2_,
                                              CONCAT22(local_14a8._2_2_ * local_1478._2_2_,sVar69)))
                ;
                uStack_f80 = CONCAT26(uStack_14a0._6_2_ * uStack_1470._6_2_,
                                      CONCAT24(uStack_14a0._4_2_ * uStack_1470._4_2_,
                                               CONCAT22(uStack_14a0._2_2_ * uStack_1470._2_2_,sVar86
                                                       )));
                local_1488._0_2_ = auVar75._0_2_;
                local_1488._2_2_ = auVar75._2_2_;
                local_1488._4_2_ = auVar75._4_2_;
                local_1488._6_2_ = auVar75._6_2_;
                uStack_1480._0_2_ = auVar75._8_2_;
                uStack_1480._2_2_ = auVar75._10_2_;
                uStack_1480._4_2_ = auVar75._12_2_;
                uStack_1480._6_2_ = auVar75._14_2_;
                local_f68 = CONCAT26(local_1488._6_2_ * local_1478._6_2_,
                                     CONCAT24(local_1488._4_2_ * local_1478._4_2_,
                                              CONCAT22(local_1488._2_2_ * local_1478._2_2_,
                                                       (short)local_1488 * (short)local_1478)));
                uStack_f60 = CONCAT26(uStack_1480._6_2_ * uStack_1470._6_2_,
                                      CONCAT24(uStack_1480._4_2_ * uStack_1470._4_2_,
                                               CONCAT22(uStack_1480._2_2_ * uStack_1470._2_2_,
                                                        (short)uStack_1480 * (short)uStack_1470)));
                sVar69 = sVar69 + sVar68;
                sVar71 = local_14a8._2_2_ * local_1478._2_2_ + sVar79;
                sVar80 = local_14a8._4_2_ * local_1478._4_2_ + sVar85;
                sVar82 = local_14a8._6_2_ * local_1478._6_2_ + sVar92;
                sVar86 = sVar86 + sVar98;
                sVar88 = uStack_14a0._2_2_ * uStack_1470._2_2_ + sVar106;
                sVar93 = uStack_14a0._4_2_ * uStack_1470._4_2_ + sVar111;
                sVar95 = uStack_14a0._6_2_ * uStack_1470._6_2_ + sVar117;
                local_1148 = CONCAT26(sVar82,CONCAT24(sVar80,CONCAT22(sVar71,sVar69)));
                uStack_1140 = CONCAT26(sVar95,CONCAT24(sVar93,CONCAT22(sVar88,sVar86)));
                sVar70 = (short)local_1488 * (short)local_1478 + sVar68;
                sVar72 = local_1488._2_2_ * local_1478._2_2_ + sVar79;
                sVar81 = local_1488._4_2_ * local_1478._4_2_ + sVar85;
                sVar83 = local_1488._6_2_ * local_1478._6_2_ + sVar92;
                sVar87 = (short)uStack_1480 * (short)uStack_1470 + sVar98;
                sVar89 = uStack_1480._2_2_ * uStack_1470._2_2_ + sVar106;
                sVar94 = uStack_1480._4_2_ * uStack_1470._4_2_ + sVar111;
                sVar96 = uStack_1480._6_2_ * uStack_1470._6_2_ + sVar117;
                local_1128 = CONCAT26(sVar83,CONCAT24(sVar81,CONCAT22(sVar72,sVar70)));
                uStack_1120 = CONCAT26(sVar96,CONCAT24(sVar94,CONCAT22(sVar89,sVar87)));
                local_1bc0 = s0_2 + 1;
                local_1bc8 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_1158 = 0x80008000800080;
                uStack_1150 = 0x80008000800080;
                local_d48 = CONCAT26(sVar82 + 0x80,
                                     CONCAT24(sVar80 + 0x80,CONCAT22(sVar71 + 0x80,sVar69 + 0x80)));
                uStack_d40 = CONCAT26(sVar95 + 0x80,
                                      CONCAT24(sVar93 + 0x80,CONCAT22(sVar88 + 0x80,sVar86 + 0x80)))
                ;
                local_e50 = &local_1be8;
                local_e58 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar42._8_8_ = uStack_d40;
                auVar42._0_8_ = local_d48;
                local_d58 = 0x101010101010101;
                uStack_d50 = 0x101010101010101;
                auVar76._8_8_ = 0x101010101010101;
                auVar76._0_8_ = 0x101010101010101;
                auVar75 = pmulhuw(auVar42,auVar76);
                local_28b8 = auVar75._0_8_;
                lStack_28b0 = auVar75._8_8_;
                s0_2[1] = local_28b8;
                s1_1[0] = lStack_28b0;
                local_1bf0 = s1_1 + 1;
                local_1bf8 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_1138 = 0x80008000800080;
                uStack_1130 = 0x80008000800080;
                local_d68 = CONCAT26(sVar83 + 0x80,
                                     CONCAT24(sVar81 + 0x80,CONCAT22(sVar72 + 0x80,sVar70 + 0x80)));
                uStack_d60 = CONCAT26(sVar96 + 0x80,
                                      CONCAT24(sVar94 + 0x80,CONCAT22(sVar89 + 0x80,sVar87 + 0x80)))
                ;
                local_e40 = &local_1c18;
                local_e48 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar77._8_8_ = uStack_d60;
                auVar77._0_8_ = local_d68;
                local_d78 = 0x101010101010101;
                uStack_d70 = 0x101010101010101;
                auVar78._8_8_ = 0x101010101010101;
                auVar78._0_8_ = 0x101010101010101;
                auVar78 = pmulhuw(auVar77,auVar78);
                local_28d8 = auVar78._0_8_;
                uStack_28d0 = auVar78._8_8_;
                local_1a18 = s1_1 + 1;
                local_1a20 = s0_2 + 1;
                local_b88._0_2_ = auVar78._0_2_;
                local_b88._2_2_ = auVar78._2_2_;
                local_b88._4_2_ = auVar78._4_2_;
                local_b88._6_2_ = auVar78._6_2_;
                uStack_b80._0_2_ = auVar78._8_2_;
                uStack_b80._2_2_ = auVar78._10_2_;
                uStack_b80._4_2_ = auVar78._12_2_;
                uStack_b80._6_2_ = auVar78._14_2_;
                local_b98._0_2_ = auVar75._0_2_;
                local_b98._2_2_ = auVar75._2_2_;
                local_b98._4_2_ = auVar75._4_2_;
                local_b98._6_2_ = auVar75._6_2_;
                uStack_b90._0_2_ = auVar75._8_2_;
                uStack_b90._2_2_ = auVar75._10_2_;
                uStack_b90._4_2_ = auVar75._12_2_;
                uStack_b90._6_2_ = auVar75._14_2_;
                local_17f8 = CONCAT17((0 < uStack_b80._6_2_) * (uStack_b80._6_2_ < 0x100) *
                                      auVar78[0xe] - (0xff < uStack_b80._6_2_),
                                      CONCAT16((0 < uStack_b80._4_2_) * (uStack_b80._4_2_ < 0x100) *
                                               auVar78[0xc] - (0xff < uStack_b80._4_2_),
                                               CONCAT15((0 < uStack_b80._2_2_) *
                                                        (uStack_b80._2_2_ < 0x100) * auVar78[10] -
                                                        (0xff < uStack_b80._2_2_),
                                                        CONCAT14((0 < (short)uStack_b80) *
                                                                 ((short)uStack_b80 < 0x100) *
                                                                 auVar78[8] -
                                                                 (0xff < (short)uStack_b80),
                                                                 CONCAT13((0 < local_b88._6_2_) *
                                                                          (local_b88._6_2_ < 0x100)
                                                                          * auVar78[6] -
                                                                          (0xff < local_b88._6_2_),
                                                                          CONCAT12((0 < local_b88.
                                                                                        _4_2_) *
                                                                                   (local_b88._4_2_
                                                                                   < 0x100) *
                                                                                   auVar78[4] -
                                                                                   (0xff < local_b88
                                                  ._4_2_),CONCAT11((0 < local_b88._2_2_) *
                                                                   (local_b88._2_2_ < 0x100) *
                                                                   auVar78[2] -
                                                                   (0xff < local_b88._2_2_),
                                                                   (0 < (short)local_b88) *
                                                                   ((short)local_b88 < 0x100) *
                                                                   auVar78[0] -
                                                                   (0xff < (short)local_b88))))))));
                lStack_17f0 = CONCAT17((0 < uStack_b90._6_2_) * (uStack_b90._6_2_ < 0x100) *
                                       auVar75[0xe] - (0xff < uStack_b90._6_2_),
                                       CONCAT16((0 < uStack_b90._4_2_) * (uStack_b90._4_2_ < 0x100)
                                                * auVar75[0xc] - (0xff < uStack_b90._4_2_),
                                                CONCAT15((0 < uStack_b90._2_2_) *
                                                         (uStack_b90._2_2_ < 0x100) * auVar75[10] -
                                                         (0xff < uStack_b90._2_2_),
                                                         CONCAT14((0 < (short)uStack_b90) *
                                                                  ((short)uStack_b90 < 0x100) *
                                                                  auVar75[8] -
                                                                  (0xff < (short)uStack_b90),
                                                                  CONCAT13((0 < local_b98._6_2_) *
                                                                           (local_b98._6_2_ < 0x100)
                                                                           * auVar75[6] -
                                                                           (0xff < local_b98._6_2_),
                                                                           CONCAT12((0 < local_b98.
                                                                                         _4_2_) *
                                                                                    (local_b98._4_2_
                                                                                    < 0x100) *
                                                                                    auVar75[4] -
                                                                                    (0xff < 
                                                  local_b98._4_2_),
                                                  CONCAT11((0 < local_b98._2_2_) *
                                                           (local_b98._2_2_ < 0x100) * auVar75[2] -
                                                           (0xff < local_b98._2_2_),
                                                           (0 < (short)local_b98) *
                                                           ((short)local_b98 < 0x100) * auVar75[0] -
                                                           (0xff < (short)local_b98))))))));
                local_17e0 = (longlong *)(lStack_2560 + local_2290 * 4);
                *local_17e0 = local_17f8;
                local_17e0[1] = lStack_17f0;
                local_2290 = local_2290 + 4;
                uStack_b80 = uStack_28d0;
                local_b88 = local_28d8;
                uStack_b90 = lStack_28b0;
                local_b98 = local_28b8;
                uStack_f70 = uVar20;
                local_f78 = uVar16;
                uStack_f90 = uVar20;
                local_f98 = uVar16;
                uStack_1300 = uVar2;
                uStack_1480 = uStack_2850;
                local_1488 = local_2858;
                uStack_1490 = uVar104;
                local_1498 = uVar74;
                uStack_14a0 = (ulong)uVar19;
                local_14a8 = (ulong)uVar18;
                uStack_14b0 = uVar104;
                local_14b8 = uVar74;
                local_1bd0 = local_1bc0;
                uStack_1be0 = uStack_d40;
                local_1be8 = local_d48;
                local_1c00 = local_1bf0;
                uStack_1c10 = uStack_d60;
                local_1c18 = local_d68;
                s0_1[0] = lStack_17f0;
                s1_1[1] = local_17f8;
              }
              for (; sVar4 = uStack_2590, local_14e8 = compositor._p32[1],
                  uStack_14e0 = compositor._u32[0], local_2290 < uStack_2590;
                  local_2290 = local_2290 + 1) {
                local_19c0 = (uint *)(lStack_2560 + local_2290 * 4);
                local_19a4 = *local_19c0;
                local_19b8._4_4_ = 0;
                local_19b8._0_4_ = local_19a4;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = local_19b8._0_8_;
                auVar75 = pmovzxbw(auVar37,local_19b8._0_8_);
                local_28f8 = auVar75._0_8_;
                uStack_28f0 = auVar75._8_8_;
                local_14c8._0_2_ = auVar75._0_2_;
                local_14c8._2_2_ = auVar75._2_2_;
                local_14c8._4_2_ = auVar75._4_2_;
                local_14c8._6_2_ = auVar75._6_2_;
                uStack_14c0._0_2_ = auVar75._8_2_;
                uStack_14c0._2_2_ = auVar75._10_2_;
                uStack_14c0._4_2_ = auVar75._12_2_;
                uStack_14c0._6_2_ = auVar75._14_2_;
                local_fa8 = CONCAT26(local_14c8._6_2_ * local_1478._6_2_,
                                     CONCAT24(local_14c8._4_2_ * local_1478._4_2_,
                                              CONCAT22(local_14c8._2_2_ * local_1478._2_2_,
                                                       (short)local_14c8 * (short)local_1478)));
                uStack_fa0 = CONCAT26(uStack_14c0._6_2_ * uStack_1470._6_2_,
                                      CONCAT24(uStack_14c0._4_2_ * uStack_1470._4_2_,
                                               CONCAT22(uStack_14c0._2_2_ * uStack_1470._2_2_,
                                                        (short)uStack_14c0 * (short)uStack_1470)));
                sVar69 = (short)local_14c8 * (short)local_1478 + sVar68;
                sVar70 = local_14c8._2_2_ * local_1478._2_2_ + sVar79;
                sVar71 = local_14c8._4_2_ * local_1478._4_2_ + sVar85;
                sVar72 = local_14c8._6_2_ * local_1478._6_2_ + sVar92;
                sVar80 = (short)uStack_14c0 * (short)uStack_1470 + sVar98;
                sVar81 = uStack_14c0._2_2_ * uStack_1470._2_2_ + sVar106;
                sVar82 = uStack_14c0._4_2_ * uStack_1470._4_2_ + sVar111;
                sVar83 = uStack_14c0._6_2_ * uStack_1470._6_2_ + sVar117;
                local_1168 = CONCAT26(sVar72,CONCAT24(sVar71,CONCAT22(sVar70,sVar69)));
                uStack_1160 = CONCAT26(sVar83,CONCAT24(sVar82,CONCAT22(sVar81,sVar80)));
                local_1ba0 = &uStack_2368;
                local_1b98 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_1178 = 0x80008000800080;
                uStack_1170 = 0x80008000800080;
                local_1bb8 = CONCAT26(sVar72 + 0x80,
                                      CONCAT24(sVar71 + 0x80,CONCAT22(sVar70 + 0x80,sVar69 + 0x80)))
                ;
                uStack_1bb0 = CONCAT26(sVar83 + 0x80,
                                       CONCAT24(sVar82 + 0x80,CONCAT22(sVar81 + 0x80,sVar80 + 0x80))
                                      );
                local_e60 = &local_1bb8;
                local_e68 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar43._8_8_ = uStack_1bb0;
                auVar43._0_8_ = local_1bb8;
                local_d38 = 0x101010101010101;
                uStack_d30 = 0x101010101010101;
                auVar25._8_8_ = 0x101010101010101;
                auVar25._0_8_ = 0x101010101010101;
                auVar75 = pmulhuw(auVar43,auVar25);
                local_2938 = auVar75._0_8_;
                uStack_2930 = auVar75._8_8_;
                local_1a08 = &uStack_2368;
                local_1a10 = &uStack_2368;
                local_bb8 = local_2938;
                uStack_bb0 = uStack_2930;
                local_ba8._0_2_ = auVar75._0_2_;
                local_ba8._2_2_ = auVar75._2_2_;
                local_ba8._4_2_ = auVar75._4_2_;
                local_ba8._6_2_ = auVar75._6_2_;
                uStack_ba0._0_2_ = auVar75._8_2_;
                uStack_ba0._2_2_ = auVar75._10_2_;
                uStack_ba0._4_2_ = auVar75._12_2_;
                uStack_ba0._6_2_ = auVar75._14_2_;
                uVar17 = CONCAT13((0 < local_ba8._6_2_) * (local_ba8._6_2_ < 0x100) * auVar75[6] -
                                  (0xff < local_ba8._6_2_),
                                  CONCAT12((0 < local_ba8._4_2_) * (local_ba8._4_2_ < 0x100) *
                                           auVar75[4] - (0xff < local_ba8._4_2_),
                                           CONCAT11((0 < local_ba8._2_2_) *
                                                    (local_ba8._2_2_ < 0x100) * auVar75[2] -
                                                    (0xff < local_ba8._2_2_),
                                                    (0 < (short)local_ba8) *
                                                    ((short)local_ba8 < 0x100) * auVar75[0] -
                                                    (0xff < (short)local_ba8))));
                uStack_2368 = CONCAT17((0 < uStack_ba0._6_2_) * (uStack_ba0._6_2_ < 0x100) *
                                       auVar75[0xe] - (0xff < uStack_ba0._6_2_),
                                       CONCAT16((0 < uStack_ba0._4_2_) * (uStack_ba0._4_2_ < 0x100)
                                                * auVar75[0xc] - (0xff < uStack_ba0._4_2_),
                                                CONCAT15((0 < uStack_ba0._2_2_) *
                                                         (uStack_ba0._2_2_ < 0x100) * auVar75[10] -
                                                         (0xff < uStack_ba0._2_2_),
                                                         CONCAT14((0 < (short)uStack_ba0) *
                                                                  ((short)uStack_ba0 < 0x100) *
                                                                  auVar75[8] -
                                                                  (0xff < (short)uStack_ba0),uVar17)
                                                        )));
                s0_2[0] = CONCAT17((0 < uStack_ba0._6_2_) * (uStack_ba0._6_2_ < 0x100) *
                                   auVar75[0xe] - (0xff < uStack_ba0._6_2_),
                                   CONCAT16((0 < uStack_ba0._4_2_) * (uStack_ba0._4_2_ < 0x100) *
                                            auVar75[0xc] - (0xff < uStack_ba0._4_2_),
                                            CONCAT15((0 < uStack_ba0._2_2_) *
                                                     (uStack_ba0._2_2_ < 0x100) * auVar75[10] -
                                                     (0xff < uStack_ba0._2_2_),
                                                     CONCAT14((0 < (short)uStack_ba0) *
                                                              ((short)uStack_ba0 < 0x100) *
                                                              auVar75[8] -
                                                              (0xff < (short)uStack_ba0),
                                                              CONCAT13((0 < local_ba8._6_2_) *
                                                                       (local_ba8._6_2_ < 0x100) *
                                                                       auVar75[6] -
                                                                       (0xff < local_ba8._6_2_),
                                                                       CONCAT12((0 < local_ba8._4_2_
                                                                                ) * (local_ba8._4_2_
                                                                                    < 0x100) *
                                                                                auVar75[4] -
                                                                                (0xff < local_ba8.
                                                                                        _4_2_),
                                                                                CONCAT11((0 < 
                                                  local_ba8._2_2_) * (local_ba8._2_2_ < 0x100) *
                                                  auVar75[2] - (0xff < local_ba8._2_2_),
                                                  (0 < (short)local_ba8) *
                                                  ((short)local_ba8 < 0x100) * auVar75[0] -
                                                  (0xff < (short)local_ba8))))))));
                *(undefined4 *)(lStack_2560 + local_2290 * 4) = uVar17;
                local_1b90 = local_1ba0;
                local_19b8 = ZEXT416(local_19a4);
                local_1638 = uStack_2368;
                lStack_1630 = s0_2[0];
                local_1628 = uStack_2368;
                lStack_1620 = s0_2[0];
                local_14d8 = uVar74;
                uStack_14d0 = uVar104;
                local_14c8 = local_28f8;
                uStack_14c0 = uStack_28f0;
                local_fb8 = uVar16;
                uStack_fb0 = uVar20;
                local_d28 = local_1bb8;
                uStack_d20 = uStack_1bb0;
                local_ba8 = local_2938;
                uStack_ba0 = uStack_2930;
              }
            }
          }
        }
        uStack_1470 = uVar105;
        local_1478 = uVar58;
        xOffset = sVar4;
        x1 = uVar63;
        if (uVar63 == 0) {
          local_25a0 = (unsigned_long)*(int *)(this + 0x30);
          uStack_25a8 = it._xorMask + 0x200;
          puVar66 = std::min<unsigned_long>(&local_25a0,&stack0xffffffffffffda58);
          uStack_2590 = *puVar66;
        }
        else {
          if (uVar63 == 0) {
            __assert_fail("bitWord != T(0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/./intutils.h"
                          ,0x151,
                          "size_t IntUtils::BitWordFlipIterator<unsigned long>::nextAndFlip() [T = unsigned long]"
                         );
          }
          uVar59 = IntUtils::ctz<unsigned_long>(uVar63);
          uVar65 = IntUtils::allOnes<unsigned_long>();
          uVar64 = IntUtils::allOnes<unsigned_long>();
          it._bitWord = uVar64 ^ it._bitWord;
          uStack_2590 = uVar62 + (ulong)uVar59 * 8;
          x1 = uVar65 << ((byte)uVar59 & 0x3f) ^ uVar63;
        }
        puVar54 = dstPix;
        lVar67 = lStack_2560;
        uVar58 = uStack_2590;
        local_a60 = xOffset;
        coverXmm[1] = (long)&x0 + 4;
        local_a28 = (ulong)x0._4_4_;
        i_1 = local_a28;
        coverXmm[0] = 0;
        local_a90 = uStack_2590 - xOffset >> 2;
        if (local_a90 != 0) {
          i_1 = CONCAT44(x0._4_4_,x0._4_4_);
          coverXmm[0] = CONCAT44(x0._4_4_,x0._4_4_);
          for (; auVar75 = stack0xfffffffffffff548, local_a90 != 0; local_a90 = local_a90 - 1) {
            local_600 = dstPix + local_a60 * 2;
            local_5f8 = dstPix + local_a60 * 2 + 4;
            local_418 = m1 + 1;
            m1[1]._4_4_ = (undefined4)((ulong)*(undefined8 *)local_600 >> 0x20);
            m0[0]._4_4_ = (int)((ulong)*(undefined8 *)(local_600 + 2) >> 0x20);
            iVar57 = m0[0]._4_4_;
            m0[0] = CONCAT44(m0[0]._4_4_,m1[1]._4_4_);
            local_420 = t1 + 1;
            t1[1]._0_4_ = (int)*(undefined8 *)local_5f8;
            t1[1]._4_4_ = (undefined4)((ulong)*(undefined8 *)local_5f8 >> 0x20);
            uVar17 = t1[1]._4_4_;
            t0[0]._0_4_ = (int)*(undefined8 *)(local_5f8 + 2);
            iVar116 = (int)t0[0];
            t0[0]._4_4_ = (uint)((ulong)*(undefined8 *)(local_5f8 + 2) >> 0x20);
            t1[1] = CONCAT44((int)t0[0],(int)t1[1]);
            t0[0] = CONCAT44(t0[0]._4_4_,uVar17);
            iStack_28c = m0[0]._4_4_;
            local_2a8 = t1[1];
            uStack_29c = t0[0]._4_4_;
            _local_298 = CONCAT44((int)*(undefined8 *)(local_600 + 2),(uint)t0[1]);
            lVar56 = s0_3[1];
            m1[0]._0_4_ = iStack_290;
            m1[0]._4_4_ = m0[0]._4_4_;
            m1[1] = CONCAT44(t0[0]._4_4_,iStack_2a0);
            local_278 = m1[1];
            lStack_270 = m0[0];
            local_288 = t1[1];
            lStack_280 = t0[0];
            local_248 = m1[1] << 0x20;
            uStack_240 = t1[1] << 0x20 | (ulong)t0[0]._4_4_;
            local_238 = m1[1];
            lStack_230 = t1[1];
            iVar91 = t0[0]._4_4_ + iStack_2a0;
            m1[1] = CONCAT44(iVar91,iStack_2a0);
            m0[0] = CONCAT44(iVar116 + (int)t1[1],(int)t1[1] + t0[0]._4_4_);
            local_398 = 0;
            uStack_390 = 0;
            local_790 = dstPix + local_a60 * 2;
            local_7a8 = 0;
            uStack_7a0 = 0;
            local_790[0] = 0;
            local_790[1] = 0;
            local_790[2] = 0;
            local_790[3] = 0;
            local_770 = dstPix + local_a60 * 2 + 4;
            local_788 = 0;
            uStack_780 = 0;
            local_770[0] = 0;
            local_770[1] = 0;
            local_770[2] = 0;
            local_770[3] = 0;
            local_258 = 0;
            uStack_250 = 0;
            local_268 = m1[1];
            lStack_260 = m0[0];
            local_380 = s0_3 + 1;
            lStack_1b0 = m1[0];
            local_1bc = 9;
            local_1b8._0_4_ = auVar75._0_4_;
            local_1b8._4_4_ = auVar75._4_4_;
            auVar75 = ZEXT416(9);
            s0_3[1] = CONCAT44(local_1b8._4_4_ >> auVar75,(int)local_1b8 >> auVar75);
            m1[0]._0_4_ = iStack_290 >> auVar75;
            m1[0]._4_4_ = iVar57 >> auVar75;
            local_3b0 = m1 + 1;
            local_3b8 = t1 + 1;
            local_218 = m1[1];
            lStack_210 = m0[0];
            local_228 = 0;
            lStack_220 = m1[1];
            iVar103 = (int)t1[1] + t0[0]._4_4_ + iStack_2a0;
            iVar116 = iVar116 + (int)t1[1] + iVar91;
            m1[1] = CONCAT44(iVar91,iStack_2a0);
            m0[0] = CONCAT44(iVar116,iVar103);
            local_3c0 = &i_1;
            local_3c8 = m1 + 1;
            sVar4 = i_1;
            lVar5 = coverXmm[0];
            local_208 = m1[1];
            lStack_200 = m0[0];
            local_1f8._0_4_ = (int)i_1;
            local_1f8._4_4_ = (int)(i_1 >> 0x20);
            uStack_1f0._0_4_ = (int)coverXmm[0];
            uStack_1f0._4_4_ = (int)((ulong)coverXmm[0] >> 0x20);
            uStack_1f0._0_4_ = (int)uStack_1f0 + iVar103;
            uStack_1f0._4_4_ = uStack_1f0._4_4_ + iVar116;
            i_1 = CONCAT44(local_1f8._4_4_ + iVar91,(int)local_1f8 + iStack_2a0);
            coverXmm[0] = CONCAT44(uStack_1f0._4_4_,(int)uStack_1f0);
            local_340 = &i_1;
            local_348 = s0_3 + 1;
            local_178 = i_1;
            lStack_170 = coverXmm[0];
            local_188 = s0_3[1];
            lStack_180 = m1[0];
            s0_3[1] = CONCAT44((local_1f8._4_4_ + iVar91) - (local_1b8._4_4_ >> auVar75),
                               ((int)local_1f8 + iStack_2a0) - ((int)local_1b8 >> auVar75));
            m1[0]._0_4_ = (int)uStack_1f0 - (iStack_290 >> auVar75);
            m1[0]._4_4_ = uStack_1f0._4_4_ - (iVar57 >> auVar75);
            local_60 = s0_3 + 1;
            local_68 = CompositorSIMD::
                       vmask<false>(unsigned_int*,unsigned_long,unsigned_long,Cell*,int&)::
                       u32_01FF_128;
            local_18 = s0_3[1];
            lStack_10 = m1[0];
            local_28 = 0x1ff000001ff;
            uStack_20 = 0x1ff000001ff;
            local_108 = s0_3[1] & 0x1ff000001ff;
            uStack_100 = m1[0] & 0x1ff000001ff;
            m1[0] = uStack_100;
            s0_3[1] = local_108;
            local_358 = s0_3 + 1;
            auVar75 = packssdw(stack0xfffffffffffff548,stack0xfffffffffffff548);
            local_350 = CompositorSIMD::
                        vmask<false>(unsigned_int*,unsigned_long,unsigned_long,Cell*,int&)::
                        u16_01FF_128;
            local_158 = 0x1ff01ff01ff01ff;
            uStack_150 = 0x1ff01ff01ff01ff;
            s0_3[1] = auVar75._0_8_;
            lVar6 = s0_3[1];
            m1[0] = auVar75._8_8_;
            lVar7 = m1[0];
            local_168._0_4_ = auVar75._0_4_;
            local_168._4_4_ = auVar75._4_4_;
            uStack_160._0_4_ = auVar75._8_4_;
            uStack_160._4_4_ = auVar75._12_4_;
            local_168._0_4_ = 0x1ff01ff - (int)local_168;
            local_168._4_4_ = 0x1ff01ff - local_168._4_4_;
            uStack_160._0_4_ = 0x1ff01ff - (int)uStack_160;
            uStack_160._4_4_ = 0x1ff01ff - uStack_160._4_4_;
            m1[1] = CONCAT44(local_168._4_4_,(int)local_168);
            m0[0] = CONCAT44(uStack_160._4_4_,(int)uStack_160);
            local_300 = m1 + 1;
            lVar8 = m1[1];
            lVar9 = m0[0];
            local_b8._0_2_ = (short)(int)local_168;
            local_b8._2_2_ = (short)((uint)(int)local_168 >> 0x10);
            local_b8._4_2_ = (short)local_168._4_4_;
            local_b8._6_2_ = (short)((uint)local_168._4_4_ >> 0x10);
            uStack_b0._0_2_ = (short)(int)uStack_160;
            uStack_b0._2_2_ = (short)((uint)(int)uStack_160 >> 0x10);
            uStack_b0._4_2_ = (short)uStack_160._4_4_;
            uStack_b0._6_2_ = (short)((uint)uStack_160._4_4_ >> 0x10);
            local_c8._0_2_ = auVar75._0_2_;
            local_c8._2_2_ = auVar75._2_2_;
            local_c8._4_2_ = auVar75._4_2_;
            local_c8._6_2_ = auVar75._6_2_;
            uStack_c0._0_2_ = auVar75._8_2_;
            uStack_c0._2_2_ = auVar75._10_2_;
            uStack_c0._4_2_ = auVar75._12_2_;
            uStack_c0._6_2_ = auVar75._14_2_;
            uVar73 = (ushort)((short)local_c8 < (short)local_b8) * (short)local_c8 |
                     (ushort)((short)local_c8 >= (short)local_b8) * (short)local_b8;
            uVar84 = (ushort)(local_c8._2_2_ < local_b8._2_2_) * local_c8._2_2_ |
                     (ushort)(local_c8._2_2_ >= local_b8._2_2_) * local_b8._2_2_;
            uVar90 = (ushort)(local_c8._4_2_ < local_b8._4_2_) * local_c8._4_2_ |
                     (ushort)(local_c8._4_2_ >= local_b8._4_2_) * local_b8._4_2_;
            uVar97 = (ushort)(local_c8._6_2_ < local_b8._6_2_) * local_c8._6_2_ |
                     (ushort)(local_c8._6_2_ >= local_b8._6_2_) * local_b8._6_2_;
            m1[1]._0_4_ = CONCAT22(uVar84,uVar73);
            m1[1]._0_6_ = CONCAT24(uVar90,(undefined4)m1[1]);
            m1[1] = CONCAT26(uVar97,(undefined6)m1[1]);
            m0[0]._0_4_ = CONCAT22((ushort)(uStack_c0._2_2_ < uStack_b0._2_2_) * uStack_c0._2_2_ |
                                   (ushort)(uStack_c0._2_2_ >= uStack_b0._2_2_) * uStack_b0._2_2_,
                                   (ushort)((short)uStack_c0 < (short)uStack_b0) * (short)uStack_c0
                                   | (ushort)((short)uStack_c0 >= (short)uStack_b0) *
                                     (short)uStack_b0);
            m0[0]._0_6_ = CONCAT24((ushort)(uStack_c0._4_2_ < uStack_b0._4_2_) * uStack_c0._4_2_ |
                                   (ushort)(uStack_c0._4_2_ >= uStack_b0._4_2_) * uStack_b0._4_2_,
                                   (undefined4)m0[0]);
            m0[0] = CONCAT26((ushort)(uStack_c0._6_2_ < uStack_b0._6_2_) * uStack_c0._6_2_ |
                             (ushort)(uStack_c0._6_2_ >= uStack_b0._6_2_) * uStack_b0._6_2_,
                             (undefined6)m0[0]);
            local_78 = m1[1];
            lStack_70 = m0[0];
            local_88 = m1[1];
            lStack_80 = m0[0];
            m1[1]._2_2_ = uVar73;
            m1[1]._0_2_ = uVar73;
            m1[1]._0_6_ = CONCAT24(uVar84,(undefined4)m1[1]);
            m1[1] = CONCAT26(uVar84,(undefined6)m1[1]);
            m0[0]._2_2_ = uVar90;
            m0[0]._0_2_ = uVar90;
            m0[0]._0_6_ = CONCAT24(uVar97,(undefined4)m0[0]);
            m0[0] = CONCAT26(uVar97,(undefined6)m0[0]);
            local_2e8 = &i_1;
            i_1 = CONCAT44(uStack_1f0._4_4_,uStack_1f0._4_4_);
            coverXmm[0] = CONCAT44(uStack_1f0._4_4_,uStack_1f0._4_4_);
            s0_3[1] = CONCAT44((undefined4)m0[0],(undefined4)m0[0]);
            local_708 = s0_3[1];
            m1[0]._0_4_ = m0[0]._4_4_;
            m1[0]._4_4_ = m0[0]._4_4_;
            uVar17 = m1[1]._4_4_;
            m1[1] = CONCAT44((undefined4)m1[1],(undefined4)m1[1]);
            m0[0] = CONCAT44(uVar17,uVar17);
            local_5f0 = (undefined1 (*) [16])(lStack_2560 + local_a60 * 4);
            auVar75 = *local_5f0;
            s1_2[1] = auVar75._0_8_;
            local_5d8 = s1_2[1];
            s0_3[0] = auVar75._8_8_;
            lVar10 = s0_3[0];
            local_5c8 = 0;
            uStack_5c0 = 0;
            local_5e8 = 0;
            uStack_5e0 = 0;
            uStack_5d0._0_1_ = auVar75[8];
            uStack_5d0._1_1_ = auVar75[9];
            uStack_5d0._2_1_ = auVar75[10];
            uStack_5d0._3_1_ = auVar75[0xb];
            uStack_5d0._4_1_ = auVar75[0xc];
            uStack_5d0._5_1_ = auVar75[0xd];
            uStack_5d0._6_1_ = auVar75[0xe];
            uStack_5d0._7_1_ = auVar75[0xf];
            t0[1]._1_1_ = 0;
            t0[1]._0_1_ = (byte)uStack_5d0;
            t0[1]._0_4_ = CONCAT13(0,CONCAT12(uStack_5d0._1_1_,(ushort)t0[1]));
            t0[1]._0_6_ = CONCAT15(0,CONCAT14(uStack_5d0._2_1_,(uint)t0[1]));
            t0[1] = CONCAT17(0,CONCAT16(uStack_5d0._3_1_,(uint6)t0[1]));
            lVar55 = t0[1];
            s1_2[0]._0_1_ = uStack_5d0._4_1_;
            s1_2[0]._1_1_ = 0;
            s1_2[0]._2_1_ = uStack_5d0._5_1_;
            s1_2[0]._3_1_ = 0;
            s1_2[0]._4_1_ = uStack_5d0._6_1_;
            s1_2[0]._5_1_ = 0;
            s1_2[0]._6_1_ = uStack_5d0._7_1_;
            auVar75 = pmovzxbw(auVar75,s1_2[1]);
            local_728 = m1[1];
            lStack_720 = m0[0];
            local_718._0_2_ = (short)compositor._p32[1];
            local_718._2_2_ = (short)((ulong)compositor._p32[1] >> 0x10);
            local_718._4_2_ = (short)((ulong)compositor._p32[1] >> 0x20);
            local_718._6_2_ = (short)((ulong)compositor._p32[1] >> 0x30);
            uStack_710._0_2_ = (short)compositor._u32[0];
            uStack_710._2_2_ = (short)((ulong)compositor._u32[0] >> 0x10);
            uStack_710._4_2_ = (short)((ulong)compositor._u32[0] >> 0x20);
            uStack_710._6_2_ = (short)((ulong)compositor._u32[0] >> 0x30);
            t1[1]._0_4_ = CONCAT22(local_718._2_2_ * uVar73,(short)local_718 * uVar73);
            t1[1] = CONCAT26(local_718._6_2_ * uVar73,CONCAT24(local_718._4_2_ * uVar73,(int)t1[1]))
            ;
            t0[0]._0_4_ = CONCAT22(uStack_710._2_2_ * uVar84,(short)uStack_710 * uVar84);
            t0[0] = CONCAT26(uStack_710._6_2_ * uVar84,
                             CONCAT24(uStack_710._4_2_ * uVar84,(int)t0[0]));
            local_6f8 = compositor._p32[1];
            lStack_6f0 = compositor._u32[0];
            lStack_700 = m1[0];
            t1[0]._0_2_ = (short)uStack_710 * uVar97;
            t1[0]._2_2_ = uStack_710._2_2_ * uVar97;
            t1[0]._4_2_ = uStack_710._4_2_ * uVar97;
            t1[0]._6_2_ = uStack_710._6_2_ * uVar97;
            local_658 = m1[1];
            lStack_650 = m0[0];
            local_668 = 0xff00ff00ff00ff;
            uStack_660 = 0xff00ff00ff00ff;
            m1[1] = m1[1] ^ 0xff00ff00ff00ff;
            uVar105 = m0[0] ^ 0xff00ff00ff00ff;
            local_638 = local_708;
            lStack_630 = m1[0];
            local_648 = 0xff00ff00ff00ff;
            uStack_640 = 0xff00ff00ff00ff;
            s0_3[1] = local_708 ^ 0xff00ff00ff00ff;
            m1[0] = m1[0] ^ 0xff00ff00ff00ff;
            s1_2[1] = auVar75._0_8_;
            lVar11 = s1_2[1];
            s0_3[0] = auVar75._8_8_;
            lVar12 = s0_3[0];
            local_6d8._0_2_ = auVar75._0_2_;
            local_6d8._2_2_ = auVar75._2_2_;
            local_6d8._4_2_ = auVar75._4_2_;
            local_6d8._6_2_ = auVar75._6_2_;
            uStack_6d0._0_2_ = auVar75._8_2_;
            uStack_6d0._2_2_ = auVar75._10_2_;
            uStack_6d0._4_2_ = auVar75._12_2_;
            uStack_6d0._6_2_ = auVar75._14_2_;
            local_6e8._0_2_ = (short)m1[1];
            local_6e8._2_2_ = (short)((ulong)m1[1] >> 0x10);
            local_6e8._4_2_ = (short)((ulong)m1[1] >> 0x20);
            local_6e8._6_2_ = (short)((ulong)m1[1] >> 0x30);
            uStack_6e0._0_2_ = (short)uVar105;
            uStack_6e0._2_2_ = (short)(uVar105 >> 0x10);
            uStack_6e0._4_2_ = (short)(uVar105 >> 0x20);
            uStack_6e0._6_2_ = (short)(uVar105 >> 0x30);
            s1_2[1]._0_4_ =
                 CONCAT22(local_6d8._2_2_ * local_6e8._2_2_,(short)local_6d8 * (short)local_6e8);
            s1_2[1]._0_6_ = CONCAT24(local_6d8._4_2_ * local_6e8._4_2_,(undefined4)s1_2[1]);
            s1_2[1] = CONCAT26(local_6d8._6_2_ * local_6e8._6_2_,(undefined6)s1_2[1]);
            s0_3[0]._0_2_ = (short)uStack_6d0 * (short)uStack_6e0;
            s0_3[0]._2_2_ = uStack_6d0._2_2_ * uStack_6e0._2_2_;
            s0_3[0]._4_2_ = uStack_6d0._4_2_ * uStack_6e0._4_2_;
            s0_3[0]._6_2_ = uStack_6d0._6_2_ * uStack_6e0._6_2_;
            s1_2[0] = (longlong)(uint7)t0[2];
            lVar13 = s1_2[0];
            local_6b8._2_2_ = (ushort)uStack_5d0._1_1_;
            local_6b8._4_2_ = (ushort)uStack_5d0._2_1_;
            local_6b8._6_2_ = (ushort)uStack_5d0._3_1_;
            uStack_6b0._0_2_ = (ushort)uStack_5d0._4_1_;
            uStack_6b0._2_2_ = (ushort)uStack_5d0._5_1_;
            uStack_6b0._4_2_ = (ushort)uStack_5d0._6_1_;
            uStack_6b0._6_2_ = (ushort)uStack_5d0._7_1_;
            local_6c8._0_2_ = (short)s0_3[1];
            local_6c8._2_2_ = (short)((ulong)s0_3[1] >> 0x10);
            local_6c8._4_2_ = (short)((ulong)s0_3[1] >> 0x20);
            local_6c8._6_2_ = (short)((ulong)s0_3[1] >> 0x30);
            uStack_6c0._0_2_ = (short)m1[0];
            uStack_6c0._2_2_ = (short)((ulong)m1[0] >> 0x10);
            uStack_6c0._4_2_ = (short)((ulong)m1[0] >> 0x20);
            uStack_6c0._6_2_ = (short)((ulong)m1[0] >> 0x30);
            local_6c8._0_2_ = (ushort)t0[1] * (short)local_6c8;
            t0[1]._0_4_ = CONCAT22(local_6b8._2_2_ * local_6c8._2_2_,(short)local_6c8);
            t0[1]._0_6_ = CONCAT24(local_6b8._4_2_ * local_6c8._4_2_,(uint)t0[1]);
            t0[1] = CONCAT26(local_6b8._6_2_ * local_6c8._6_2_,(uint6)t0[1]);
            s1_2[0]._0_2_ = (ushort)uStack_6b0 * (short)uStack_6c0;
            s1_2[0]._2_2_ = uStack_6b0._2_2_ * uStack_6c0._2_2_;
            s1_2[0]._4_2_ = uStack_6b0._4_2_ * uStack_6c0._4_2_;
            s1_2[0]._6_2_ = uStack_6b0._6_2_ * uStack_6c0._6_2_;
            local_548 = s1_2[1];
            lStack_540 = s0_3[0];
            local_558 = t1[1];
            lStack_550 = t0[0];
            local_858 = (short)local_6d8 * (short)local_6e8 + (short)local_718 * uVar73;
            sStack_856 = local_6d8._2_2_ * local_6e8._2_2_ + local_718._2_2_ * uVar73;
            sStack_854 = local_6d8._4_2_ * local_6e8._4_2_ + local_718._4_2_ * uVar73;
            sStack_852 = local_6d8._6_2_ * local_6e8._6_2_ + local_718._6_2_ * uVar73;
            sStack_850 = (short)uStack_6d0 * (short)uStack_6e0 + (short)uStack_710 * uVar84;
            sStack_84e = uStack_6d0._2_2_ * uStack_6e0._2_2_ + uStack_710._2_2_ * uVar84;
            sStack_84c = uStack_6d0._4_2_ * uStack_6e0._4_2_ + uStack_710._4_2_ * uVar84;
            sStack_84a = uStack_6d0._6_2_ * uStack_6e0._6_2_ + uStack_710._6_2_ * uVar84;
            s1_2[1]._0_4_ = CONCAT22(sStack_856,local_858);
            s1_2[1]._0_6_ = CONCAT24(sStack_854,(undefined4)s1_2[1]);
            s1_2[1] = CONCAT26(sStack_852,(undefined6)s1_2[1]);
            s0_3[0]._0_2_ = sStack_850;
            s0_3[0]._2_2_ = sStack_84e;
            s0_3[0]._4_2_ = sStack_84c;
            s0_3[0]._6_2_ = sStack_84a;
            local_528 = t0[1];
            lStack_520 = s1_2[0];
            local_538 = CONCAT26(local_718._6_2_ * uVar90,
                                 CONCAT24(local_718._4_2_ * uVar90,
                                          CONCAT22(local_718._2_2_ * uVar90,
                                                   (short)local_718 * uVar90)));
            uStack_530 = CONCAT26(t1[0]._6_2_,
                                  CONCAT24(t1[0]._4_2_,CONCAT22(t1[0]._2_2_,(short)t1[0])));
            local_6c8._0_2_ = (short)local_6c8 + (short)local_718 * uVar90;
            sStack_886 = local_6b8._2_2_ * local_6c8._2_2_ + local_718._2_2_ * uVar90;
            sStack_884 = local_6b8._4_2_ * local_6c8._4_2_ + local_718._4_2_ * uVar90;
            sStack_882 = local_6b8._6_2_ * local_6c8._6_2_ + local_718._6_2_ * uVar90;
            sStack_880 = (ushort)uStack_6b0 * (short)uStack_6c0 + (short)t1[0];
            sStack_87e = uStack_6b0._2_2_ * uStack_6c0._2_2_ + t1[0]._2_2_;
            sStack_87c = uStack_6b0._4_2_ * uStack_6c0._4_2_ + t1[0]._4_2_;
            sStack_87a = uStack_6b0._6_2_ * uStack_6c0._6_2_ + t1[0]._6_2_;
            t0[1]._0_4_ = CONCAT22(sStack_886,(short)local_6c8);
            t0[1]._0_6_ = CONCAT24(sStack_884,(uint)t0[1]);
            t0[1] = CONCAT26(sStack_882,(uint6)t0[1]);
            s1_2[0]._0_2_ = sStack_880;
            s1_2[0]._2_2_ = sStack_87e;
            s1_2[0]._4_2_ = sStack_87c;
            s1_2[0]._6_2_ = sStack_87a;
            local_848 = s1_2 + 1;
            local_840 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_5a8 = s1_2[1];
            lStack_5a0 = s0_3[0];
            local_5b8 = 0x80008000800080;
            uStack_5b0 = 0x80008000800080;
            local_858 = local_858 + 0x80;
            sStack_856 = sStack_856 + 0x80;
            sStack_854 = sStack_854 + 0x80;
            sStack_852 = sStack_852 + 0x80;
            sStack_850 = sStack_850 + 0x80;
            sStack_84e = sStack_84e + 0x80;
            sStack_84c = sStack_84c + 0x80;
            sStack_84a = sStack_84a + 0x80;
            local_4f0 = &local_858;
            local_4f8 = SIMD::(anonymous_namespace)::u16_0101_128;
            local_478 = CONCAT26(sStack_852,CONCAT24(sStack_854,CONCAT22(sStack_856,local_858)));
            uStack_470 = CONCAT26(sStack_84a,CONCAT24(sStack_84c,CONCAT22(sStack_84e,sStack_850)));
            auVar53._2_2_ = sStack_856;
            auVar53._0_2_ = local_858;
            auVar53._4_2_ = sStack_854;
            auVar53._6_2_ = sStack_852;
            auVar53._8_2_ = sStack_850;
            auVar53._10_2_ = sStack_84e;
            auVar53._12_2_ = sStack_84c;
            auVar53._14_2_ = sStack_84a;
            local_488 = 0x101010101010101;
            uStack_480 = 0x101010101010101;
            auVar35._8_8_ = 0x101010101010101;
            auVar35._0_8_ = 0x101010101010101;
            auVar75 = pmulhuw(auVar53,auVar35);
            local_870 = t0 + 1;
            local_868 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_588 = t0[1];
            lStack_580 = s1_2[0];
            local_598 = 0x80008000800080;
            uStack_590 = 0x80008000800080;
            local_888 = (short)local_6c8 + 0x80;
            sStack_886 = sStack_886 + 0x80;
            sStack_884 = sStack_884 + 0x80;
            sStack_882 = sStack_882 + 0x80;
            sStack_880 = sStack_880 + 0x80;
            sStack_87e = sStack_87e + 0x80;
            sStack_87c = sStack_87c + 0x80;
            sStack_87a = sStack_87a + 0x80;
            local_4e0 = &local_888;
            local_4e8 = SIMD::(anonymous_namespace)::u16_0101_128;
            local_498 = CONCAT26(sStack_882,CONCAT24(sStack_884,CONCAT22(sStack_886,local_888)));
            uStack_490 = CONCAT26(sStack_87a,CONCAT24(sStack_87c,CONCAT22(sStack_87e,sStack_880)));
            auVar52._2_2_ = sStack_886;
            auVar52._0_2_ = local_888;
            auVar52._4_2_ = sStack_884;
            auVar52._6_2_ = sStack_882;
            auVar52._8_2_ = sStack_880;
            auVar52._10_2_ = sStack_87e;
            auVar52._12_2_ = sStack_87c;
            auVar52._14_2_ = sStack_87a;
            local_4a8 = 0x101010101010101;
            uStack_4a0 = 0x101010101010101;
            auVar34._8_8_ = 0x101010101010101;
            auVar34._0_8_ = 0x101010101010101;
            register0x00001200 = pmulhuw(auVar52,auVar34);
            local_818 = s1_2 + 1;
            local_820 = t0 + 1;
            s1_2[1] = auVar75._0_8_;
            lVar14 = s1_2[1];
            s0_3[0] = auVar75._8_8_;
            lVar15 = s0_3[0];
            local_458._0_2_ = auVar75._0_2_;
            local_458._2_2_ = auVar75._2_2_;
            local_458._4_2_ = auVar75._4_2_;
            local_458._6_2_ = auVar75._6_2_;
            uStack_450._0_2_ = auVar75._8_2_;
            uStack_450._2_2_ = auVar75._10_2_;
            uStack_450._4_2_ = auVar75._12_2_;
            uStack_450._6_2_ = auVar75._14_2_;
            local_468._0_2_ = (short)t0[1];
            local_468._2_2_ = t0[1]._2_2_;
            local_468._4_2_ = t0[1]._4_2_;
            local_468._6_2_ = t0[1]._6_2_;
            uStack_460._0_2_ = (short)t0[2];
            uStack_460._2_2_ = t0[2]._2_2_;
            uStack_460._4_2_ = t0[2]._4_2_;
            uStack_460._6_2_ = t0[2]._6_2_;
            s1_2[1]._0_4_ =
                 CONCAT13((0 < local_458._6_2_) * (local_458._6_2_ < 0x100) * auVar75[6] -
                          (0xff < local_458._6_2_),
                          CONCAT12((0 < local_458._4_2_) * (local_458._4_2_ < 0x100) * auVar75[4] -
                                   (0xff < local_458._4_2_),
                                   CONCAT11((0 < local_458._2_2_) * (local_458._2_2_ < 0x100) *
                                            auVar75[2] - (0xff < local_458._2_2_),
                                            (0 < (short)local_458) * ((short)local_458 < 0x100) *
                                            auVar75[0] - (0xff < (short)local_458))));
            s1_2[1]._0_6_ =
                 CONCAT15((0 < uStack_450._2_2_) * (uStack_450._2_2_ < 0x100) * auVar75[10] -
                          (0xff < uStack_450._2_2_),
                          CONCAT14((0 < (short)uStack_450) * ((short)uStack_450 < 0x100) *
                                   auVar75[8] - (0xff < (short)uStack_450),(undefined4)s1_2[1]));
            s1_2[1] = CONCAT17((0 < uStack_450._6_2_) * (uStack_450._6_2_ < 0x100) * auVar75[0xe] -
                               (0xff < uStack_450._6_2_),
                               CONCAT16((0 < uStack_450._4_2_) * (uStack_450._4_2_ < 0x100) *
                                        auVar75[0xc] - (0xff < uStack_450._4_2_),(undefined6)s1_2[1]
                                       ));
            s0_3[0]._0_1_ =
                 (0 < (short)local_468) * ((short)local_468 < 0x100) * (char)t0[1] -
                 (0xff < (short)local_468);
            s0_3[0]._1_1_ =
                 (0 < local_468._2_2_) * (local_468._2_2_ < 0x100) * t0[1]._2_1_ -
                 (0xff < local_468._2_2_);
            s0_3[0]._2_1_ =
                 (0 < local_468._4_2_) * (local_468._4_2_ < 0x100) * t0[1]._4_1_ -
                 (0xff < local_468._4_2_);
            s0_3[0]._3_1_ =
                 (0 < local_468._6_2_) * (local_468._6_2_ < 0x100) * t0[1]._6_1_ -
                 (0xff < local_468._6_2_);
            s0_3[0]._4_1_ =
                 (0 < (short)uStack_460) * ((short)uStack_460 < 0x100) * (char)t0[2] -
                 (0xff < (short)uStack_460);
            s0_3[0]._5_1_ =
                 (0 < uStack_460._2_2_) * (uStack_460._2_2_ < 0x100) * t0[2]._2_1_ -
                 (0xff < uStack_460._2_2_);
            s0_3[0]._6_1_ =
                 (0 < uStack_460._4_2_) * (uStack_460._4_2_ < 0x100) * t0[2]._4_1_ -
                 (0xff < uStack_460._4_2_);
            s0_3[0]._7_1_ =
                 (0 < uStack_460._6_2_) * (uStack_460._6_2_ < 0x100) * t0[2]._6_1_ -
                 (0xff < uStack_460._6_2_);
            local_750 = (longlong *)(lStack_2560 + local_a60 * 4);
            local_768 = s1_2[1];
            lStack_760 = s0_3[0];
            *local_750 = s1_2[1];
            local_750[1] = s0_3[0];
            local_a60 = local_a60 + 4;
            local_860 = local_870;
            local_838 = local_848;
            local_718 = compositor._p32[1];
            uStack_710 = compositor._u32[0];
            local_6e8 = m1[1];
            uStack_6e0 = uVar105;
            local_6d8 = lVar11;
            uStack_6d0 = lVar12;
            local_6c8 = s0_3[1];
            uStack_6c0 = m1[0];
            local_6b8 = lVar55;
            uStack_6b0 = lVar13;
            uStack_5d0 = lVar10;
            local_468 = t0[1];
            uStack_460 = s1_2[0];
            local_458 = lVar14;
            uStack_450 = lVar15;
            local_410 = local_420;
            local_408 = local_418;
            local_400 = local_418;
            local_3f8 = local_420;
            local_3f0 = local_420;
            local_3e8 = local_418;
            local_3e0 = local_418;
            local_3a8 = local_420;
            local_3a0 = local_418;
            local_328 = local_358;
            local_320 = local_358;
            local_308 = local_358;
            local_2f8 = local_300;
            local_2f0 = local_300;
            local_2e0 = local_300;
            local_2d8 = local_300;
            local_1f8 = sVar4;
            uStack_1f0 = lVar5;
            local_1b8 = lVar56;
            local_168 = lVar6;
            uStack_160 = lVar7;
            local_f8 = local_108;
            uStack_f0 = uStack_100;
            local_c8 = lVar6;
            uStack_c0 = lVar7;
            local_b8 = lVar8;
            uStack_b0 = lVar9;
          }
        }
        for (; sVar4 = local_1d8, local_1d8._0_4_ = (int)i_1, local_a60 < uVar58;
            local_a60 = local_a60 + 1) {
          local_7d0 = puVar54 + local_a60 * 2;
          local_7ac = *local_7d0;
          local_7c8._4_4_ = 0;
          local_7c8._0_4_ = local_7ac;
          uStack_b28 = local_7c8._0_8_;
          t0_1[0] = 0;
          local_7f0 = puVar54 + local_a60 * 2 + 1;
          local_7d4 = *local_7f0;
          local_7e8 = ZEXT416(local_7d4);
          stack0xfffffffffffff4f8 = ZEXT416(local_7d4);
          local_3d0 = &i_1;
          local_3d8 = &uStack_b28;
          sVar4 = i_1;
          lStack_1d0 = coverXmm[0];
          local_1e8 = local_7c8._0_8_;
          uStack_1e0 = 0;
          local_1d8._4_4_ = (undefined4)(i_1 >> 0x20);
          i_1 = CONCAT44(local_1d8._4_4_,(int)local_1d8 + local_7ac);
          local_7c8 = ZEXT416(local_7ac);
          local_1d8 = sVar4;
          Cell::reset((Cell *)(puVar54 + local_a60 * 2));
          local_388 = s0_4 + 1;
          lVar5 = s0_4[1];
          lVar6 = m0_1[0];
          local_19c = 9;
          local_198._0_4_ = (int)s0_4[1];
          local_198._4_4_ = s0_4[1]._4_4_;
          uStack_190._0_4_ = (int)s0_4[2];
          uStack_190._4_4_ = s0_4[2]._4_4_;
          auVar75 = ZEXT416(9);
          s0_4[1] = CONCAT44(local_198._4_4_ >> auVar75,(int)local_198 >> auVar75);
          m0_1[0]._0_4_ = (int)uStack_190 >> auVar75;
          m0_1[0]._4_4_ = uStack_190._4_4_ >> auVar75;
          local_360 = &i_1;
          local_368 = s0_4 + 1;
          local_148 = s0_4[1];
          lStack_140 = m0_1[0];
          local_138._0_4_ = (int)i_1;
          local_138._4_4_ = (int)(i_1 >> 0x20);
          uStack_130._0_4_ = (int)coverXmm[0];
          uStack_130._4_4_ = (int)((ulong)coverXmm[0] >> 0x20);
          s0_4[1] = CONCAT44(local_138._4_4_ - (local_198._4_4_ >> auVar75),
                             (int)local_138 - ((int)local_198 >> auVar75));
          m0_1[0]._0_4_ = (int)uStack_130 - ((int)uStack_190 >> auVar75);
          m0_1[0]._4_4_ = uStack_130._4_4_ - (uStack_190._4_4_ >> auVar75);
          local_50 = s0_4 + 1;
          local_58 = CompositorSIMD::
                     vmask<false>(unsigned_int*,unsigned_long,unsigned_long,Cell*,int&)::
                     u32_01FF_128;
          local_38 = s0_4[1];
          lStack_30 = m0_1[0];
          local_48 = 0x1ff000001ff;
          uStack_40 = 0x1ff000001ff;
          local_e8 = s0_4[1] & 0x1ff000001ff;
          uStack_e0 = m0_1[0] & 0x1ff000001ff;
          m0_1[0] = uStack_e0;
          s0_4[1] = local_e8;
          local_378 = s0_4 + 1;
          auVar75 = packssdw(stack0xfffffffffffff4f8,stack0xfffffffffffff4f8);
          local_370 = CompositorSIMD::
                      vmask<false>(unsigned_int*,unsigned_long,unsigned_long,Cell*,int&)::
                      u32_01FF_128;
          local_118 = 0x1ff000001ff;
          uStack_110 = 0x1ff000001ff;
          s0_4[1] = auVar75._0_8_;
          lVar7 = s0_4[1];
          m0_1[0] = auVar75._8_8_;
          lVar8 = m0_1[0];
          local_128._0_4_ = auVar75._0_4_;
          local_128._4_4_ = auVar75._4_4_;
          uStack_120._0_4_ = auVar75._8_4_;
          uStack_120._4_4_ = auVar75._12_4_;
          local_128._0_4_ = 0x1ff - (int)local_128;
          local_128._4_4_ = 0x1ff - local_128._4_4_;
          uStack_120._0_4_ = 0x1ff - (int)uStack_120;
          uStack_120._4_4_ = 0x1ff - uStack_120._4_4_;
          uStack_b28 = CONCAT44(local_128._4_4_,(int)local_128);
          t0_1[0] = CONCAT44(uStack_120._4_4_,(int)uStack_120);
          local_318 = &uStack_b28;
          uVar16 = uStack_b28;
          lVar9 = t0_1[0];
          local_98._0_2_ = auVar75._0_2_;
          local_98._2_2_ = auVar75._2_2_;
          local_98._4_2_ = auVar75._4_2_;
          local_98._6_2_ = auVar75._6_2_;
          uStack_90._0_2_ = auVar75._8_2_;
          uStack_90._2_2_ = auVar75._10_2_;
          uStack_90._4_2_ = auVar75._12_2_;
          uStack_90._6_2_ = auVar75._14_2_;
          local_a8._0_2_ = (short)(int)local_128;
          local_a8._2_2_ = (short)((uint)(int)local_128 >> 0x10);
          local_a8._4_2_ = (short)local_128._4_4_;
          local_a8._6_2_ = (short)((uint)local_128._4_4_ >> 0x10);
          uStack_a0._0_2_ = (short)(int)uStack_120;
          uStack_a0._2_2_ = (short)((uint)(int)uStack_120 >> 0x10);
          uStack_a0._4_2_ = (short)uStack_120._4_4_;
          uStack_a0._6_2_ = (short)((uint)uStack_120._4_4_ >> 0x10);
          s0_4[1] = CONCAT26((ushort)(local_a8._6_2_ < local_98._6_2_) * local_a8._6_2_ |
                             (ushort)(local_a8._6_2_ >= local_98._6_2_) * local_98._6_2_,
                             CONCAT24((ushort)(local_a8._4_2_ < local_98._4_2_) * local_a8._4_2_ |
                                      (ushort)(local_a8._4_2_ >= local_98._4_2_) * local_98._4_2_,
                                      CONCAT22((ushort)(local_a8._2_2_ < local_98._2_2_) *
                                               local_a8._2_2_ |
                                               (ushort)(local_a8._2_2_ >= local_98._2_2_) *
                                               local_98._2_2_,
                                               (ushort)((short)local_a8 < (short)local_98) *
                                               (short)local_a8 |
                                               (ushort)((short)local_a8 >= (short)local_98) *
                                               (short)local_98)));
          m0_1[0]._0_2_ =
               (ushort)((short)uStack_a0 < (short)uStack_90) * (short)uStack_a0 |
               (ushort)((short)uStack_a0 >= (short)uStack_90) * (short)uStack_90;
          m0_1[0]._2_2_ =
               (ushort)(uStack_a0._2_2_ < uStack_90._2_2_) * uStack_a0._2_2_ |
               (ushort)(uStack_a0._2_2_ >= uStack_90._2_2_) * uStack_90._2_2_;
          m0_1[0]._4_2_ =
               (ushort)(uStack_a0._4_2_ < uStack_90._4_2_) * uStack_a0._4_2_ |
               (ushort)(uStack_a0._4_2_ >= uStack_90._4_2_) * uStack_90._4_2_;
          m0_1[0]._6_2_ =
               (ushort)(uStack_a0._6_2_ < uStack_90._6_2_) * uStack_a0._6_2_ |
               (ushort)(uStack_a0._6_2_ >= uStack_90._6_2_) * uStack_90._6_2_;
          local_810 = (uint *)(lVar67 + local_a60 * 4);
          local_7f4 = *local_810;
          local_808 = ZEXT416(local_7f4);
          stack0xfffffffffffff4e8 = ZEXT416(local_7f4);
          auVar75 = pshuflw(stack0xfffffffffffff4f8,stack0xfffffffffffff4f8,0);
          local_8a0 = t0_1 + 1;
          local_9f8 = (ulong)local_7f4;
          auVar78 = pmovzxbw(stack0xfffffffffffff4e8,local_9f8);
          s0_4[1] = auVar75._0_8_;
          lVar10 = s0_4[1];
          m0_1[0] = auVar75._8_8_;
          lVar11 = m0_1[0];
          local_698._0_2_ = auVar75._0_2_;
          local_698._2_2_ = auVar75._2_2_;
          local_698._4_2_ = auVar75._4_2_;
          local_698._6_2_ = auVar75._6_2_;
          uStack_690._0_2_ = auVar75._8_2_;
          uStack_690._2_2_ = auVar75._10_2_;
          uStack_690._4_2_ = auVar75._12_2_;
          uStack_690._6_2_ = auVar75._14_2_;
          local_6a8._0_2_ = (short)compositor._p32[1];
          local_6a8._2_2_ = (short)((ulong)compositor._p32[1] >> 0x10);
          local_6a8._4_2_ = (short)((ulong)compositor._p32[1] >> 0x20);
          local_6a8._6_2_ = (short)((ulong)compositor._p32[1] >> 0x30);
          uStack_6a0._0_2_ = (short)compositor._u32[0];
          uStack_6a0._2_2_ = (short)((ulong)compositor._u32[0] >> 0x10);
          uStack_6a0._4_2_ = (short)((ulong)compositor._u32[0] >> 0x20);
          uStack_6a0._6_2_ = (short)((ulong)compositor._u32[0] >> 0x30);
          uStack_b28 = CONCAT26(local_698._6_2_ * local_6a8._6_2_,
                                CONCAT24(local_698._4_2_ * local_6a8._4_2_,
                                         CONCAT22(local_698._2_2_ * local_6a8._2_2_,
                                                  (short)local_698 * (short)local_6a8)));
          t0_1[0] = CONCAT26(uStack_690._6_2_ * uStack_6a0._6_2_,
                             CONCAT24(uStack_690._4_2_ * uStack_6a0._4_2_,
                                      CONCAT22(uStack_690._2_2_ * uStack_6a0._2_2_,
                                               (short)uStack_690 * (short)uStack_6a0)));
          local_618 = s0_4[1];
          lStack_610 = m0_1[0];
          local_628 = 0xff00ff00ff00ff;
          uStack_620 = 0xff00ff00ff00ff;
          s0_4[1] = s0_4[1] ^ 0xff00ff00ff00ff;
          m0_1[0] = m0_1[0] ^ 0xff00ff00ff00ff;
          t0_1[1] = auVar78._0_8_;
          lVar12 = t0_1[1];
          s0_4[0] = auVar78._8_8_;
          lVar13 = s0_4[0];
          local_678._0_2_ = auVar78._0_2_;
          local_678._2_2_ = auVar78._2_2_;
          local_678._4_2_ = auVar78._4_2_;
          local_678._6_2_ = auVar78._6_2_;
          uStack_670._0_2_ = auVar78._8_2_;
          uStack_670._2_2_ = auVar78._10_2_;
          uStack_670._4_2_ = auVar78._12_2_;
          uStack_670._6_2_ = auVar78._14_2_;
          local_688._0_2_ = (short)s0_4[1];
          local_688._2_2_ = (short)((ulong)s0_4[1] >> 0x10);
          local_688._4_2_ = (short)((ulong)s0_4[1] >> 0x20);
          local_688._6_2_ = (short)((ulong)s0_4[1] >> 0x30);
          uStack_680._0_2_ = (short)m0_1[0];
          uStack_680._2_2_ = (short)((ulong)m0_1[0] >> 0x10);
          uStack_680._4_2_ = (short)((ulong)m0_1[0] >> 0x20);
          uStack_680._6_2_ = (short)((ulong)m0_1[0] >> 0x30);
          t0_1[1]._0_4_ =
               CONCAT22(local_678._2_2_ * local_688._2_2_,(short)local_678 * (short)local_688);
          t0_1[1]._0_6_ = CONCAT24(local_678._4_2_ * local_688._4_2_,(undefined4)t0_1[1]);
          t0_1[1] = CONCAT26(local_678._6_2_ * local_688._6_2_,(undefined6)t0_1[1]);
          s0_4[0]._0_2_ = (short)uStack_670 * (short)uStack_680;
          s0_4[0]._2_2_ = uStack_670._2_2_ * uStack_680._2_2_;
          s0_4[0]._4_2_ = uStack_670._4_2_ * uStack_680._4_2_;
          s0_4[0]._6_2_ = uStack_670._6_2_ * uStack_680._6_2_;
          local_508 = t0_1[1];
          lStack_500 = s0_4[0];
          local_518 = uStack_b28;
          lStack_510 = t0_1[0];
          local_8b8 = (short)local_678 * (short)local_688 + (short)local_698 * (short)local_6a8;
          sStack_8b6 = local_678._2_2_ * local_688._2_2_ + local_698._2_2_ * local_6a8._2_2_;
          sStack_8b4 = local_678._4_2_ * local_688._4_2_ + local_698._4_2_ * local_6a8._4_2_;
          sStack_8b2 = local_678._6_2_ * local_688._6_2_ + local_698._6_2_ * local_6a8._6_2_;
          sStack_8b0 = (short)uStack_670 * (short)uStack_680 + (short)uStack_690 * (short)uStack_6a0
          ;
          sStack_8ae = uStack_670._2_2_ * uStack_680._2_2_ + uStack_690._2_2_ * uStack_6a0._2_2_;
          sStack_8ac = uStack_670._4_2_ * uStack_680._4_2_ + uStack_690._4_2_ * uStack_6a0._4_2_;
          sStack_8aa = uStack_670._6_2_ * uStack_680._6_2_ + uStack_690._6_2_ * uStack_6a0._6_2_;
          t0_1[1]._0_4_ = CONCAT22(sStack_8b6,local_8b8);
          t0_1[1]._0_6_ = CONCAT24(sStack_8b4,(undefined4)t0_1[1]);
          t0_1[1] = CONCAT26(sStack_8b2,(undefined6)t0_1[1]);
          s0_4[0]._0_2_ = sStack_8b0;
          s0_4[0]._2_2_ = sStack_8ae;
          s0_4[0]._4_2_ = sStack_8ac;
          s0_4[0]._6_2_ = sStack_8aa;
          local_898 = SIMD::(anonymous_namespace)::u16_0080_128;
          local_568 = t0_1[1];
          lStack_560 = s0_4[0];
          local_578 = 0x80008000800080;
          uStack_570 = 0x80008000800080;
          local_8b8 = local_8b8 + 0x80;
          sStack_8b6 = sStack_8b6 + 0x80;
          sStack_8b4 = sStack_8b4 + 0x80;
          sStack_8b2 = sStack_8b2 + 0x80;
          sStack_8b0 = sStack_8b0 + 0x80;
          sStack_8ae = sStack_8ae + 0x80;
          sStack_8ac = sStack_8ac + 0x80;
          sStack_8aa = sStack_8aa + 0x80;
          local_4d0 = &local_8b8;
          local_4d8 = SIMD::(anonymous_namespace)::u16_0101_128;
          local_4b8 = CONCAT26(sStack_8b2,CONCAT24(sStack_8b4,CONCAT22(sStack_8b6,local_8b8)));
          uStack_4b0 = CONCAT26(sStack_8aa,CONCAT24(sStack_8ac,CONCAT22(sStack_8ae,sStack_8b0)));
          auVar51._2_2_ = sStack_8b6;
          auVar51._0_2_ = local_8b8;
          auVar51._4_2_ = sStack_8b4;
          auVar51._6_2_ = sStack_8b2;
          auVar51._8_2_ = sStack_8b0;
          auVar51._10_2_ = sStack_8ae;
          auVar51._12_2_ = sStack_8ac;
          auVar51._14_2_ = sStack_8aa;
          local_4c8 = 0x101010101010101;
          uStack_4c0 = 0x101010101010101;
          auVar33._8_8_ = 0x101010101010101;
          auVar33._0_8_ = 0x101010101010101;
          auVar75 = pmulhuw(auVar51,auVar33);
          t0_1[1] = auVar75._0_8_;
          lVar14 = t0_1[1];
          s0_4[0] = auVar75._8_8_;
          lVar15 = s0_4[0];
          local_448 = t0_1[1];
          lStack_440 = s0_4[0];
          local_438._0_2_ = auVar75._0_2_;
          local_438._2_2_ = auVar75._2_2_;
          local_438._4_2_ = auVar75._4_2_;
          local_438._6_2_ = auVar75._6_2_;
          uStack_430._0_2_ = auVar75._8_2_;
          uStack_430._2_2_ = auVar75._10_2_;
          uStack_430._4_2_ = auVar75._12_2_;
          uStack_430._6_2_ = auVar75._14_2_;
          t0_1[1]._1_1_ =
               (0 < local_438._2_2_) * (local_438._2_2_ < 0x100) * auVar75[2] -
               (0xff < local_438._2_2_);
          t0_1[1]._0_1_ =
               (0 < (short)local_438) * ((short)local_438 < 0x100) * auVar75[0] -
               (0xff < (short)local_438);
          t0_1[1]._2_1_ =
               (0 < local_438._4_2_) * (local_438._4_2_ < 0x100) * auVar75[4] -
               (0xff < local_438._4_2_);
          t0_1[1]._3_1_ =
               (0 < local_438._6_2_) * (local_438._6_2_ < 0x100) * auVar75[6] -
               (0xff < local_438._6_2_);
          t0_1[1]._0_6_ =
               CONCAT15((0 < uStack_430._2_2_) * (uStack_430._2_2_ < 0x100) * auVar75[10] -
                        (0xff < uStack_430._2_2_),
                        CONCAT14((0 < (short)uStack_430) * ((short)uStack_430 < 0x100) * auVar75[8]
                                 - (0xff < (short)uStack_430),(undefined4)t0_1[1]));
          t0_1[1] = CONCAT17((0 < uStack_430._6_2_) * (uStack_430._6_2_ < 0x100) * auVar75[0xe] -
                             (0xff < uStack_430._6_2_),
                             CONCAT16((0 < uStack_430._4_2_) * (uStack_430._4_2_ < 0x100) *
                                      auVar75[0xc] - (0xff < uStack_430._4_2_),(undefined6)t0_1[1]))
          ;
          s0_4[0]._0_1_ =
               (0 < (short)local_438) * ((short)local_438 < 0x100) * auVar75[0] -
               (0xff < (short)local_438);
          s0_4[0]._1_1_ =
               (0 < local_438._2_2_) * (local_438._2_2_ < 0x100) * auVar75[2] -
               (0xff < local_438._2_2_);
          s0_4[0]._2_1_ =
               (0 < local_438._4_2_) * (local_438._4_2_ < 0x100) * auVar75[4] -
               (0xff < local_438._4_2_);
          s0_4[0]._3_1_ =
               (0 < local_438._6_2_) * (local_438._6_2_ < 0x100) * auVar75[6] -
               (0xff < local_438._6_2_);
          s0_4[0]._4_1_ =
               (0 < (short)uStack_430) * ((short)uStack_430 < 0x100) * auVar75[8] -
               (0xff < (short)uStack_430);
          s0_4[0]._5_1_ =
               (0 < uStack_430._2_2_) * (uStack_430._2_2_ < 0x100) * auVar75[10] -
               (0xff < uStack_430._2_2_);
          s0_4[0]._6_1_ =
               (0 < uStack_430._4_2_) * (uStack_430._4_2_ < 0x100) * auVar75[0xc] -
               (0xff < uStack_430._4_2_);
          s0_4[0]._7_1_ =
               (0 < uStack_430._6_2_) * (uStack_430._6_2_ < 0x100) * auVar75[0xe] -
               (0xff < uStack_430._6_2_);
          local_748 = t0_1[1];
          lStack_740 = s0_4[0];
          *(undefined4 *)(lVar67 + local_a60 * 4) = (undefined4)t0_1[1];
          local_890 = local_8a0;
          local_830 = local_8a0;
          local_828 = local_8a0;
          local_738 = local_748;
          lStack_730 = lStack_740;
          local_6a8 = compositor._p32[1];
          uStack_6a0 = compositor._u32[0];
          local_698 = lVar10;
          uStack_690 = lVar11;
          local_688 = s0_4[1];
          uStack_680 = m0_1[0];
          local_678 = lVar12;
          uStack_670 = lVar13;
          local_438 = lVar14;
          uStack_430 = lVar15;
          local_338 = local_378;
          local_330 = local_378;
          local_310 = local_378;
          local_198 = lVar5;
          uStack_190 = lVar6;
          local_138 = i_1;
          uStack_130 = coverXmm[0];
          local_128 = lVar7;
          uStack_120 = lVar8;
          local_d8 = local_e8;
          uStack_d0 = uStack_e0;
          local_a8 = uVar16;
          uStack_a0 = lVar9;
          local_98 = lVar7;
          uStack_90 = lVar8;
        }
        local_2d0 = &i_1;
        local_2c8 = i_1;
        lStack_2c0 = coverXmm[0];
        *(int *)coverXmm[1] = (int)local_1d8;
        xOffset = uStack_2590;
        local_2b8 = local_2c8;
        lStack_2b0 = lStack_2c0;
        local_1d8 = sVar4;
      }
      it._xorMask = it._xorMask + 0x200;
      cellLine = cellLine + 1;
      cell = (Cell *)((long)&cell[-1].area + 3);
    } while (cell != (Cell *)0x0);
    uVar58 = local_1578;
    uVar105 = uStack_1570;
    if (xOffset < (ulong)(long)*(int *)(this + 0x30)) {
      local_b30 = x0._4_4_ & 0x1ff;
      if (0xff < local_b30) {
        local_b30 = 0x1ff - local_b30;
      }
      if (local_b30 != 0) {
        uVar63 = (ulong)*(int *)(this + 0x30);
        local_2380 = xOffset;
        mVal_1[1] = uVar63 - xOffset >> 2;
        if (local_b30 == 0xff) {
          for (; 7 < (ulong)mVal_1[1]; mVal_1[1] = mVal_1[1] + -8) {
            local_18e0 = (undefined8 *)(lStack_2560 + local_2380 * 4);
            local_18f8 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_18f0 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_18e0 = local_18f8;
            local_18e0[1] = uStack_18f0;
            lVar67 = lStack_2560 + local_2380 * 4;
            local_18c0 = (undefined8 *)(lVar67 + 0x10);
            local_18d8 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_18d0 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_18c0 = local_18d8;
            *(undefined8 *)(lVar67 + 0x18) = uStack_18d0;
            lVar67 = lStack_2560 + local_2380 * 4;
            local_18a0 = (undefined8 *)(lVar67 + 0x20);
            local_18b8 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_18b0 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_18a0 = local_18b8;
            *(undefined8 *)(lVar67 + 0x28) = uStack_18b0;
            lVar67 = lStack_2560 + local_2380 * 4;
            local_1880 = (undefined8 *)(lVar67 + 0x30);
            local_1898 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_1890 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_1880 = local_1898;
            *(undefined8 *)(lVar67 + 0x38) = uStack_1890;
            lVar67 = lStack_2560 + local_2380 * 4;
            local_1860 = (undefined8 *)(lVar67 + 0x40);
            local_1878 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_1870 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_1860 = local_1878;
            *(undefined8 *)(lVar67 + 0x48) = uStack_1870;
            lVar67 = lStack_2560 + local_2380 * 4;
            local_1840 = (undefined8 *)(lVar67 + 0x50);
            local_1858 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_1850 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_1840 = local_1858;
            *(undefined8 *)(lVar67 + 0x58) = uStack_1850;
            lVar67 = lStack_2560 + local_2380 * 4;
            local_1820 = (undefined8 *)(lVar67 + 0x60);
            local_1838 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_1830 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_1820 = local_1838;
            *(undefined8 *)(lVar67 + 0x68) = uStack_1830;
            lVar67 = lStack_2560 + local_2380 * 4;
            local_1800 = (undefined8 *)(lVar67 + 0x70);
            local_1818 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_1810 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_1800 = local_1818;
            *(undefined8 *)(lVar67 + 0x78) = uStack_1810;
            local_2380 = local_2380 + 0x20;
          }
          for (; mVal_1[1] != 0; mVal_1[1] = mVal_1[1] + -1) {
            local_1900 = (undefined8 *)(lStack_2560 + local_2380 * 4);
            local_1918 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_1910 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *local_1900 = local_1918;
            local_1900[1] = uStack_1910;
            local_2380 = local_2380 + 4;
          }
          for (; local_2380 < uVar63; local_2380 = local_2380 + 1) {
            local_1658 = CONCAT44(nBits._4_4_,(uint32_t)nBits);
            uStack_1650 = CONCAT44(compositor._p32[0]._4_4_,(uint32_t)compositor._p32[0]);
            *(uint32_t *)(lStack_2560 + local_2380 * 4) = (uint32_t)nBits;
            local_1648 = local_1658;
            uStack_1640 = uStack_1650;
          }
        }
        else {
          auVar75 = pshuflw(ZEXT416(local_b30),ZEXT416(local_b30),0);
          local_23b8 = auVar75._0_4_;
          sStack_23a8 = auVar75._0_2_;
          sStack_23a6 = auVar75._2_2_;
          local_15f8 = CONCAT26(sStack_23a6,CONCAT24(sStack_23a8,local_23b8));
          uStack_15f0 = CONCAT26(sStack_23a6,CONCAT24(sStack_23a8,local_23b8));
          local_15e8._0_2_ = (short)compositor._p32[1];
          local_15e8._2_2_ = (short)((ulong)compositor._p32[1] >> 0x10);
          local_15e8._4_2_ = (short)((ulong)compositor._p32[1] >> 0x20);
          local_15e8._6_2_ = (short)((ulong)compositor._p32[1] >> 0x30);
          uStack_15e0._0_2_ = (short)compositor._u32[0];
          uStack_15e0._2_2_ = (short)((ulong)compositor._u32[0] >> 0x10);
          uStack_15e0._4_2_ = (short)((ulong)compositor._u32[0] >> 0x20);
          uStack_15e0._6_2_ = (short)((ulong)compositor._u32[0] >> 0x30);
          sVar68 = (short)local_15e8 * sStack_23a8;
          sVar79 = local_15e8._2_2_ * sStack_23a6;
          sVar85 = local_15e8._4_2_ * sStack_23a8;
          sVar92 = local_15e8._6_2_ * sStack_23a6;
          sVar98 = (short)uStack_15e0 * sStack_23a8;
          sVar106 = uStack_15e0._2_2_ * sStack_23a6;
          sVar111 = uStack_15e0._4_2_ * sStack_23a8;
          sVar117 = uStack_15e0._6_2_ * sStack_23a6;
          uVar16 = CONCAT26(sVar92,CONCAT24(sVar85,CONCAT22(sVar79,sVar68)));
          uVar20 = CONCAT26(sVar117,CONCAT24(sVar111,CONCAT22(sVar106,sVar98)));
          local_13e8 = sStack_23a8;
          sStack_13e6 = sStack_23a6;
          sStack_13e4 = sStack_23a8;
          sStack_13e2 = sStack_23a6;
          sStack_13e0 = sStack_23a8;
          sStack_13de = sStack_23a6;
          sStack_13dc = sStack_23a8;
          sStack_13da = sStack_23a6;
          local_13f8 = 0xff00ff00ff00ff;
          uStack_13f0 = 0xff00ff00ff00ff;
          uVar74 = CONCAT26(sStack_23a6,CONCAT24(sStack_23a8,local_23b8)) ^ 0xff00ff00ff00ff;
          uVar104 = CONCAT26(sStack_23a6,CONCAT24(sStack_23a8,local_23b8)) ^ 0xff00ff00ff00ff;
          while( true ) {
            uVar105 = uStack_1570;
            uVar58 = local_1578;
            local_1578._0_2_ = (short)uVar74;
            local_1578._2_2_ = (short)(uVar74 >> 0x10);
            local_1578._4_2_ = (short)(uVar74 >> 0x20);
            local_1578._6_2_ = (short)(uVar74 >> 0x30);
            uStack_1570._0_2_ = (short)uVar104;
            uStack_1570._2_2_ = (short)(uVar104 >> 0x10);
            uStack_1570._4_2_ = (short)(uVar104 >> 0x20);
            uStack_1570._6_2_ = (short)(uVar104 >> 0x30);
            if ((ulong)mVal_1[1] < 2) break;
            local_13a8 = (undefined1 (*) [16])(lStack_2560 + local_2380 * 4);
            local_1348 = *(undefined8 *)*local_13a8;
            uVar2 = *(undefined8 *)(*local_13a8 + 8);
            lVar67 = lStack_2560 + local_2380 * 4;
            local_13a0 = (undefined1 (*) [16])(lVar67 + 0x10);
            local_1328 = *(undefined8 *)*local_13a0;
            uVar3 = *(undefined8 *)(lVar67 + 0x18);
            local_12a8 = 0;
            uStack_12a0 = 0;
            local_1358 = 0;
            uStack_1350 = 0;
            uStack_1340._0_1_ = (byte)uVar2;
            uStack_1340._1_1_ = (byte)((ulong)uVar2 >> 8);
            uStack_1340._2_1_ = (byte)((ulong)uVar2 >> 0x10);
            uStack_1340._3_1_ = (byte)((ulong)uVar2 >> 0x18);
            uStack_1340._4_1_ = (byte)((ulong)uVar2 >> 0x20);
            uStack_1340._5_1_ = (byte)((ulong)uVar2 >> 0x28);
            uStack_1340._6_1_ = (byte)((ulong)uVar2 >> 0x30);
            uStack_1340._7_1_ = (byte)((ulong)uVar2 >> 0x38);
            local_1298 = 0;
            uStack_1290 = 0;
            local_1338 = 0;
            uStack_1330 = 0;
            uStack_1320._0_1_ = (byte)uVar3;
            uStack_1320._1_1_ = (byte)((ulong)uVar3 >> 8);
            uStack_1320._2_1_ = (byte)((ulong)uVar3 >> 0x10);
            uStack_1320._3_1_ = (byte)((ulong)uVar3 >> 0x18);
            uStack_1320._4_1_ = (byte)((ulong)uVar3 >> 0x20);
            uStack_1320._5_1_ = (byte)((ulong)uVar3 >> 0x28);
            uStack_1320._6_1_ = (byte)((ulong)uVar3 >> 0x30);
            uStack_1320._7_1_ = (byte)((ulong)uVar3 >> 0x38);
            auVar75 = pmovzxbw(*local_13a8,local_1348);
            local_2a68 = auVar75._0_8_;
            uStack_2a60 = auVar75._8_8_;
            auVar78 = pmovzxbw(*local_13a0,local_1328);
            local_2a78 = auVar78._0_8_;
            uStack_2a70 = auVar78._8_8_;
            local_1568._2_2_ = (ushort)uStack_1340._1_1_;
            local_1568._4_2_ = (ushort)uStack_1340._2_1_;
            local_1568._6_2_ = (ushort)uStack_1340._3_1_;
            uStack_1560._2_2_ = (ushort)uStack_1340._5_1_;
            uStack_1560._4_2_ = (ushort)uStack_1340._6_1_;
            uStack_1560._6_2_ = (ushort)uStack_1340._7_1_;
            sVar69 = (ushort)(byte)uStack_1340 * (short)local_1578;
            sVar99 = (ushort)uStack_1340._4_1_ * (short)uStack_1570;
            local_1028 = CONCAT26(local_1568._6_2_ * local_1578._6_2_,
                                  CONCAT24(local_1568._4_2_ * local_1578._4_2_,
                                           CONCAT22(local_1568._2_2_ * local_1578._2_2_,sVar69)));
            uStack_1020 = CONCAT26(uStack_1560._6_2_ * uStack_1570._6_2_,
                                   CONCAT24(uStack_1560._4_2_ * uStack_1570._4_2_,
                                            CONCAT22(uStack_1560._2_2_ * uStack_1570._2_2_,sVar99)))
            ;
            local_1548._2_2_ = (ushort)uStack_1320._1_1_;
            local_1548._4_2_ = (ushort)uStack_1320._2_1_;
            local_1548._6_2_ = (ushort)uStack_1320._3_1_;
            uStack_1540._2_2_ = (ushort)uStack_1320._5_1_;
            uStack_1540._4_2_ = (ushort)uStack_1320._6_1_;
            uStack_1540._6_2_ = (ushort)uStack_1320._7_1_;
            sVar70 = (ushort)(byte)uStack_1320 * (short)local_1578;
            sVar100 = (ushort)uStack_1320._4_1_ * (short)uStack_1570;
            local_1008 = CONCAT26(local_1548._6_2_ * local_1578._6_2_,
                                  CONCAT24(local_1548._4_2_ * local_1578._4_2_,
                                           CONCAT22(local_1548._2_2_ * local_1578._2_2_,sVar70)));
            uStack_1000 = CONCAT26(uStack_1540._6_2_ * uStack_1570._6_2_,
                                   CONCAT24(uStack_1540._4_2_ * uStack_1570._4_2_,
                                            CONCAT22(uStack_1540._2_2_ * uStack_1570._2_2_,sVar100))
                                  );
            local_1528._0_2_ = auVar75._0_2_;
            local_1528._2_2_ = auVar75._2_2_;
            local_1528._4_2_ = auVar75._4_2_;
            local_1528._6_2_ = auVar75._6_2_;
            uStack_1520._0_2_ = auVar75._8_2_;
            uStack_1520._2_2_ = auVar75._10_2_;
            uStack_1520._4_2_ = auVar75._12_2_;
            uStack_1520._6_2_ = auVar75._14_2_;
            local_fe8 = CONCAT26(local_1528._6_2_ * local_1578._6_2_,
                                 CONCAT24(local_1528._4_2_ * local_1578._4_2_,
                                          CONCAT22(local_1528._2_2_ * local_1578._2_2_,
                                                   (short)local_1528 * (short)local_1578)));
            uStack_fe0 = CONCAT26(uStack_1520._6_2_ * uStack_1570._6_2_,
                                  CONCAT24(uStack_1520._4_2_ * uStack_1570._4_2_,
                                           CONCAT22(uStack_1520._2_2_ * uStack_1570._2_2_,
                                                    (short)uStack_1520 * (short)uStack_1570)));
            local_1508._0_2_ = auVar78._0_2_;
            local_1508._2_2_ = auVar78._2_2_;
            local_1508._4_2_ = auVar78._4_2_;
            local_1508._6_2_ = auVar78._6_2_;
            uStack_1500._0_2_ = auVar78._8_2_;
            uStack_1500._2_2_ = auVar78._10_2_;
            uStack_1500._4_2_ = auVar78._12_2_;
            uStack_1500._6_2_ = auVar78._14_2_;
            local_fc8 = CONCAT26(local_1508._6_2_ * local_1578._6_2_,
                                 CONCAT24(local_1508._4_2_ * local_1578._4_2_,
                                          CONCAT22(local_1508._2_2_ * local_1578._2_2_,
                                                   (short)local_1508 * (short)local_1578)));
            uStack_fc0 = CONCAT26(uStack_1500._6_2_ * uStack_1570._6_2_,
                                  CONCAT24(uStack_1500._4_2_ * uStack_1570._4_2_,
                                           CONCAT22(uStack_1500._2_2_ * uStack_1570._2_2_,
                                                    (short)uStack_1500 * (short)uStack_1570)));
            sVar69 = sVar69 + sVar68;
            sVar80 = local_1568._2_2_ * local_1578._2_2_ + sVar79;
            sVar86 = local_1568._4_2_ * local_1578._4_2_ + sVar85;
            sVar93 = local_1568._6_2_ * local_1578._6_2_ + sVar92;
            sVar99 = sVar99 + sVar98;
            sVar107 = uStack_1560._2_2_ * uStack_1570._2_2_ + sVar106;
            sVar112 = uStack_1560._4_2_ * uStack_1570._4_2_ + sVar111;
            sVar118 = uStack_1560._6_2_ * uStack_1570._6_2_ + sVar117;
            local_11e8 = CONCAT26(sVar93,CONCAT24(sVar86,CONCAT22(sVar80,sVar69)));
            uStack_11e0 = CONCAT26(sVar118,CONCAT24(sVar112,CONCAT22(sVar107,sVar99)));
            sVar70 = sVar70 + sVar68;
            sVar81 = local_1548._2_2_ * local_1578._2_2_ + sVar79;
            sVar87 = local_1548._4_2_ * local_1578._4_2_ + sVar85;
            sVar94 = local_1548._6_2_ * local_1578._6_2_ + sVar92;
            sVar100 = sVar100 + sVar98;
            sVar108 = uStack_1540._2_2_ * uStack_1570._2_2_ + sVar106;
            sVar113 = uStack_1540._4_2_ * uStack_1570._4_2_ + sVar111;
            sVar119 = uStack_1540._6_2_ * uStack_1570._6_2_ + sVar117;
            local_11c8 = CONCAT26(sVar94,CONCAT24(sVar87,CONCAT22(sVar81,sVar70)));
            uStack_11c0 = CONCAT26(sVar119,CONCAT24(sVar113,CONCAT22(sVar108,sVar100)));
            sVar71 = (short)local_1528 * (short)local_1578 + sVar68;
            sVar82 = local_1528._2_2_ * local_1578._2_2_ + sVar79;
            sVar88 = local_1528._4_2_ * local_1578._4_2_ + sVar85;
            sVar95 = local_1528._6_2_ * local_1578._6_2_ + sVar92;
            sVar101 = (short)uStack_1520 * (short)uStack_1570 + sVar98;
            sVar109 = uStack_1520._2_2_ * uStack_1570._2_2_ + sVar106;
            sVar114 = uStack_1520._4_2_ * uStack_1570._4_2_ + sVar111;
            sVar120 = uStack_1520._6_2_ * uStack_1570._6_2_ + sVar117;
            local_11a8 = CONCAT26(sVar95,CONCAT24(sVar88,CONCAT22(sVar82,sVar71)));
            uStack_11a0 = CONCAT26(sVar120,CONCAT24(sVar114,CONCAT22(sVar109,sVar101)));
            sVar72 = (short)local_1508 * (short)local_1578 + sVar68;
            sVar83 = local_1508._2_2_ * local_1578._2_2_ + sVar79;
            sVar89 = local_1508._4_2_ * local_1578._4_2_ + sVar85;
            sVar96 = local_1508._6_2_ * local_1578._6_2_ + sVar92;
            sVar102 = (short)uStack_1500 * (short)uStack_1570 + sVar98;
            sVar110 = uStack_1500._2_2_ * uStack_1570._2_2_ + sVar106;
            sVar115 = uStack_1500._4_2_ * uStack_1570._4_2_ + sVar111;
            sVar121 = uStack_1500._6_2_ * uStack_1570._6_2_ + sVar117;
            local_1188 = CONCAT26(sVar96,CONCAT24(sVar89,CONCAT22(sVar83,sVar72)));
            uStack_1180 = CONCAT26(sVar121,CONCAT24(sVar115,CONCAT22(sVar110,sVar102)));
            local_1ae0 = s2_1 + 1;
            local_1ad8 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_11f8 = 0x80008000800080;
            uStack_11f0 = 0x80008000800080;
            local_1af8 = CONCAT26(sVar93 + 0x80,
                                  CONCAT24(sVar86 + 0x80,CONCAT22(sVar80 + 0x80,sVar69 + 0x80)));
            uStack_1af0 = CONCAT26(sVar118 + 0x80,
                                   CONCAT24(sVar112 + 0x80,CONCAT22(sVar107 + 0x80,sVar99 + 0x80)));
            local_ea0 = &local_1af8;
            local_ea8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar47._8_8_ = uStack_1af0;
            auVar47._0_8_ = local_1af8;
            local_cb8 = 0x101010101010101;
            uStack_cb0 = 0x101010101010101;
            auVar29._8_8_ = 0x101010101010101;
            auVar29._0_8_ = 0x101010101010101;
            auVar75 = pmulhuw(auVar47,auVar29);
            local_2b18 = auVar75._0_8_;
            s2_1[1] = local_2b18;
            lStack_2b10 = auVar75._8_8_;
            s1_3[0] = lStack_2b10;
            local_1b10 = s0_6 + 1;
            local_1b08 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_11d8 = 0x80008000800080;
            uStack_11d0 = 0x80008000800080;
            local_1b28 = CONCAT26(sVar94 + 0x80,
                                  CONCAT24(sVar87 + 0x80,CONCAT22(sVar81 + 0x80,sVar70 + 0x80)));
            uStack_1b20 = CONCAT26(sVar119 + 0x80,
                                   CONCAT24(sVar113 + 0x80,CONCAT22(sVar108 + 0x80,sVar100 + 0x80)))
            ;
            local_e90 = &local_1b28;
            local_e98 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar46._8_8_ = uStack_1b20;
            auVar46._0_8_ = local_1b28;
            local_cd8 = 0x101010101010101;
            uStack_cd0 = 0x101010101010101;
            auVar28._8_8_ = 0x101010101010101;
            auVar28._0_8_ = 0x101010101010101;
            auVar78 = pmulhuw(auVar46,auVar28);
            local_2b38 = auVar78._0_8_;
            s0_6[1] = local_2b38;
            lStack_2b30 = auVar78._8_8_;
            s3_1[0] = lStack_2b30;
            local_1b40 = s1_3 + 1;
            local_1b38 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_11b8 = 0x80008000800080;
            uStack_11b0 = 0x80008000800080;
            local_1b58 = CONCAT26(sVar95 + 0x80,
                                  CONCAT24(sVar88 + 0x80,CONCAT22(sVar82 + 0x80,sVar71 + 0x80)));
            uStack_1b50 = CONCAT26(sVar120 + 0x80,
                                   CONCAT24(sVar114 + 0x80,CONCAT22(sVar109 + 0x80,sVar101 + 0x80)))
            ;
            local_e80 = &local_1b58;
            local_e88 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar45._8_8_ = uStack_1b50;
            auVar45._0_8_ = local_1b58;
            local_cf8 = 0x101010101010101;
            uStack_cf0 = 0x101010101010101;
            auVar27._8_8_ = 0x101010101010101;
            auVar27._0_8_ = 0x101010101010101;
            auVar76 = pmulhuw(auVar45,auVar27);
            local_2b58 = auVar76._0_8_;
            uStack_2b50 = auVar76._8_8_;
            local_1b70 = s3_1 + 1;
            local_1b68 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_1198 = 0x80008000800080;
            uStack_1190 = 0x80008000800080;
            local_1b88 = CONCAT26(sVar96 + 0x80,
                                  CONCAT24(sVar89 + 0x80,CONCAT22(sVar83 + 0x80,sVar72 + 0x80)));
            uStack_1b80 = CONCAT26(sVar121 + 0x80,
                                   CONCAT24(sVar115 + 0x80,CONCAT22(sVar110 + 0x80,sVar102 + 0x80)))
            ;
            local_e70 = &local_1b88;
            local_e78 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar44._8_8_ = uStack_1b80;
            auVar44._0_8_ = local_1b88;
            local_d18 = 0x101010101010101;
            uStack_d10 = 0x101010101010101;
            auVar26._8_8_ = 0x101010101010101;
            auVar26._0_8_ = 0x101010101010101;
            auVar77 = pmulhuw(auVar44,auVar26);
            local_2b78 = auVar77._0_8_;
            uStack_2b70 = auVar77._8_8_;
            local_19e8 = s1_3 + 1;
            local_19f0 = s2_1 + 1;
            local_be8._0_2_ = auVar76._0_2_;
            local_be8._2_2_ = auVar76._2_2_;
            local_be8._4_2_ = auVar76._4_2_;
            local_be8._6_2_ = auVar76._6_2_;
            uStack_be0._0_2_ = auVar76._8_2_;
            uStack_be0._2_2_ = auVar76._10_2_;
            uStack_be0._4_2_ = auVar76._12_2_;
            uStack_be0._6_2_ = auVar76._14_2_;
            local_bf8._0_2_ = auVar75._0_2_;
            local_bf8._2_2_ = auVar75._2_2_;
            local_bf8._4_2_ = auVar75._4_2_;
            local_bf8._6_2_ = auVar75._6_2_;
            uStack_bf0._0_2_ = auVar75._8_2_;
            uStack_bf0._2_2_ = auVar75._10_2_;
            uStack_bf0._4_2_ = auVar75._12_2_;
            uStack_bf0._6_2_ = auVar75._14_2_;
            s1_3[1] = CONCAT17((0 < uStack_be0._6_2_) * (uStack_be0._6_2_ < 0x100) * auVar76[0xe] -
                               (0xff < uStack_be0._6_2_),
                               CONCAT16((0 < uStack_be0._4_2_) * (uStack_be0._4_2_ < 0x100) *
                                        auVar76[0xc] - (0xff < uStack_be0._4_2_),
                                        CONCAT15((0 < uStack_be0._2_2_) * (uStack_be0._2_2_ < 0x100)
                                                 * auVar76[10] - (0xff < uStack_be0._2_2_),
                                                 CONCAT14((0 < (short)uStack_be0) *
                                                          ((short)uStack_be0 < 0x100) * auVar76[8] -
                                                          (0xff < (short)uStack_be0),
                                                          CONCAT13((0 < local_be8._6_2_) *
                                                                   (local_be8._6_2_ < 0x100) *
                                                                   auVar76[6] -
                                                                   (0xff < local_be8._6_2_),
                                                                   CONCAT12((0 < local_be8._4_2_) *
                                                                            (local_be8._4_2_ < 0x100
                                                                            ) * auVar76[4] -
                                                                            (0xff < local_be8._4_2_)
                                                                            ,CONCAT11((0 < local_be8
                                                  ._2_2_) * (local_be8._2_2_ < 0x100) * auVar76[2] -
                                                  (0xff < local_be8._2_2_),
                                                  (0 < (short)local_be8) *
                                                  ((short)local_be8 < 0x100) * auVar76[0] -
                                                  (0xff < (short)local_be8))))))));
            lStack_1950 = CONCAT17((0 < uStack_bf0._6_2_) * (uStack_bf0._6_2_ < 0x100) *
                                   auVar75[0xe] - (0xff < uStack_bf0._6_2_),
                                   CONCAT16((0 < uStack_bf0._4_2_) * (uStack_bf0._4_2_ < 0x100) *
                                            auVar75[0xc] - (0xff < uStack_bf0._4_2_),
                                            CONCAT15((0 < uStack_bf0._2_2_) *
                                                     (uStack_bf0._2_2_ < 0x100) * auVar75[10] -
                                                     (0xff < uStack_bf0._2_2_),
                                                     CONCAT14((0 < (short)uStack_bf0) *
                                                              ((short)uStack_bf0 < 0x100) *
                                                              auVar75[8] -
                                                              (0xff < (short)uStack_bf0),
                                                              CONCAT13((0 < local_bf8._6_2_) *
                                                                       (local_bf8._6_2_ < 0x100) *
                                                                       auVar75[6] -
                                                                       (0xff < local_bf8._6_2_),
                                                                       CONCAT12((0 < local_bf8._4_2_
                                                                                ) * (local_bf8._4_2_
                                                                                    < 0x100) *
                                                                                auVar75[4] -
                                                                                (0xff < local_bf8.
                                                                                        _4_2_),
                                                                                CONCAT11((0 < 
                                                  local_bf8._2_2_) * (local_bf8._2_2_ < 0x100) *
                                                  auVar75[2] - (0xff < local_bf8._2_2_),
                                                  (0 < (short)local_bf8) *
                                                  ((short)local_bf8 < 0x100) * auVar75[0] -
                                                  (0xff < (short)local_bf8))))))));
            local_19f8 = s3_1 + 1;
            local_1a00 = s0_6 + 1;
            local_bc8._0_2_ = auVar77._0_2_;
            local_bc8._2_2_ = auVar77._2_2_;
            local_bc8._4_2_ = auVar77._4_2_;
            local_bc8._6_2_ = auVar77._6_2_;
            uStack_bc0._0_2_ = auVar77._8_2_;
            uStack_bc0._2_2_ = auVar77._10_2_;
            uStack_bc0._4_2_ = auVar77._12_2_;
            uStack_bc0._6_2_ = auVar77._14_2_;
            local_bd8._0_2_ = auVar78._0_2_;
            local_bd8._2_2_ = auVar78._2_2_;
            local_bd8._4_2_ = auVar78._4_2_;
            local_bd8._6_2_ = auVar78._6_2_;
            uStack_bd0._0_2_ = auVar78._8_2_;
            uStack_bd0._2_2_ = auVar78._10_2_;
            uStack_bd0._4_2_ = auVar78._12_2_;
            uStack_bd0._6_2_ = auVar78._14_2_;
            s3_1[1] = CONCAT17((0 < uStack_bc0._6_2_) * (uStack_bc0._6_2_ < 0x100) * auVar77[0xe] -
                               (0xff < uStack_bc0._6_2_),
                               CONCAT16((0 < uStack_bc0._4_2_) * (uStack_bc0._4_2_ < 0x100) *
                                        auVar77[0xc] - (0xff < uStack_bc0._4_2_),
                                        CONCAT15((0 < uStack_bc0._2_2_) * (uStack_bc0._2_2_ < 0x100)
                                                 * auVar77[10] - (0xff < uStack_bc0._2_2_),
                                                 CONCAT14((0 < (short)uStack_bc0) *
                                                          ((short)uStack_bc0 < 0x100) * auVar77[8] -
                                                          (0xff < (short)uStack_bc0),
                                                          CONCAT13((0 < local_bc8._6_2_) *
                                                                   (local_bc8._6_2_ < 0x100) *
                                                                   auVar77[6] -
                                                                   (0xff < local_bc8._6_2_),
                                                                   CONCAT12((0 < local_bc8._4_2_) *
                                                                            (local_bc8._4_2_ < 0x100
                                                                            ) * auVar77[4] -
                                                                            (0xff < local_bc8._4_2_)
                                                                            ,CONCAT11((0 < local_bc8
                                                  ._2_2_) * (local_bc8._2_2_ < 0x100) * auVar77[2] -
                                                  (0xff < local_bc8._2_2_),
                                                  (0 < (short)local_bc8) *
                                                  ((short)local_bc8 < 0x100) * auVar77[0] -
                                                  (0xff < (short)local_bc8))))))));
            s2_1[0] = CONCAT17((0 < uStack_bd0._6_2_) * (uStack_bd0._6_2_ < 0x100) * auVar78[0xe] -
                               (0xff < uStack_bd0._6_2_),
                               CONCAT16((0 < uStack_bd0._4_2_) * (uStack_bd0._4_2_ < 0x100) *
                                        auVar78[0xc] - (0xff < uStack_bd0._4_2_),
                                        CONCAT15((0 < uStack_bd0._2_2_) * (uStack_bd0._2_2_ < 0x100)
                                                 * auVar78[10] - (0xff < uStack_bd0._2_2_),
                                                 CONCAT14((0 < (short)uStack_bd0) *
                                                          ((short)uStack_bd0 < 0x100) * auVar78[8] -
                                                          (0xff < (short)uStack_bd0),
                                                          CONCAT13((0 < local_bd8._6_2_) *
                                                                   (local_bd8._6_2_ < 0x100) *
                                                                   auVar78[6] -
                                                                   (0xff < local_bd8._6_2_),
                                                                   CONCAT12((0 < local_bd8._4_2_) *
                                                                            (local_bd8._4_2_ < 0x100
                                                                            ) * auVar78[4] -
                                                                            (0xff < local_bd8._4_2_)
                                                                            ,CONCAT11((0 < local_bd8
                                                  ._2_2_) * (local_bd8._2_2_ < 0x100) * auVar78[2] -
                                                  (0xff < local_bd8._2_2_),
                                                  (0 < (short)local_bd8) *
                                                  ((short)local_bd8 < 0x100) * auVar78[0] -
                                                  (0xff < (short)local_bd8))))))));
            local_1940 = (longlong *)(lStack_2560 + local_2380 * 4);
            *local_1940 = s1_3[1];
            local_1940[1] = lStack_1950;
            lVar67 = lStack_2560 + local_2380 * 4;
            local_1920 = (longlong *)(lVar67 + 0x10);
            *local_1920 = s3_1[1];
            *(longlong *)(lVar67 + 0x18) = s2_1[0];
            local_2380 = local_2380 + 8;
            mVal_1[1] = mVal_1[1] + -2;
            local_1b60 = local_1b70;
            local_1b30 = local_1b40;
            local_1b00 = local_1b10;
            local_1ad0 = local_1ae0;
            local_1958 = s1_3[1];
            local_1938 = s3_1[1];
            lStack_1930 = s2_1[0];
            local_1578 = uVar74;
            uStack_1570 = uVar104;
            local_1568 = (ulong)CONCAT16(uStack_1340._3_1_,
                                         (uint6)CONCAT14(uStack_1340._2_1_,
                                                         (uint)CONCAT12(uStack_1340._1_1_,
                                                                        (ushort)(byte)uStack_1340)))
            ;
            uStack_1560 = (ulong)CONCAT16(uStack_1340._7_1_,
                                          (uint6)CONCAT14(uStack_1340._6_1_,
                                                          (uint)CONCAT12(uStack_1340._5_1_,
                                                                         (ushort)uStack_1340._4_1_))
                                         );
            local_1558 = uVar74;
            uStack_1550 = uVar104;
            local_1548 = (ulong)CONCAT16(uStack_1320._3_1_,
                                         (uint6)CONCAT14(uStack_1320._2_1_,
                                                         (uint)CONCAT12(uStack_1320._1_1_,
                                                                        (ushort)(byte)uStack_1320)))
            ;
            uStack_1540 = (ulong)CONCAT16(uStack_1320._7_1_,
                                          (uint6)CONCAT14(uStack_1320._6_1_,
                                                          (uint)CONCAT12(uStack_1320._5_1_,
                                                                         (ushort)uStack_1320._4_1_))
                                         );
            local_1538 = uVar74;
            uStack_1530 = uVar104;
            local_1528 = local_2a68;
            uStack_1520 = uStack_2a60;
            local_1518 = uVar74;
            uStack_1510 = uVar104;
            local_1508 = local_2a78;
            uStack_1500 = uStack_2a70;
            uStack_1340 = uVar2;
            uStack_1320 = uVar3;
            local_1038 = uVar16;
            uStack_1030 = uVar20;
            local_1018 = uVar16;
            uStack_1010 = uVar20;
            local_ff8 = uVar16;
            uStack_ff0 = uVar20;
            local_fd8 = uVar16;
            uStack_fd0 = uVar20;
            local_d08 = local_1b88;
            uStack_d00 = uStack_1b80;
            local_ce8 = local_1b58;
            uStack_ce0 = uStack_1b50;
            local_cc8 = local_1b28;
            uStack_cc0 = uStack_1b20;
            local_ca8 = local_1af8;
            uStack_ca0 = uStack_1af0;
            local_bf8 = local_2b18;
            uStack_bf0 = lStack_2b10;
            local_be8 = local_2b58;
            uStack_be0 = uStack_2b50;
            local_bd8 = local_2b38;
            uStack_bd0 = lStack_2b30;
            local_bc8 = local_2b78;
            uStack_bc0 = uStack_2b70;
          }
          if (mVal_1[1] != 0) {
            local_13b8 = (undefined1 (*) [16])(lStack_2560 + local_2380 * 4);
            local_1368 = *(undefined8 *)*local_13b8;
            uVar2 = *(undefined8 *)(*local_13b8 + 8);
            local_13b0 = lStack_2560 + local_2380 * 4 + 0x10;
            local_12b8 = 0;
            uStack_12b0 = 0;
            local_1378 = 0;
            uStack_1370 = 0;
            uStack_1360._0_1_ = (byte)uVar2;
            uStack_1360._1_1_ = (byte)((ulong)uVar2 >> 8);
            uStack_1360._2_1_ = (byte)((ulong)uVar2 >> 0x10);
            uStack_1360._3_1_ = (byte)((ulong)uVar2 >> 0x18);
            uStack_1360._4_1_ = (byte)((ulong)uVar2 >> 0x20);
            uStack_1360._5_1_ = (byte)((ulong)uVar2 >> 0x28);
            uStack_1360._6_1_ = (byte)((ulong)uVar2 >> 0x30);
            uStack_1360._7_1_ = (byte)((ulong)uVar2 >> 0x38);
            uVar18 = CONCAT16(uStack_1360._3_1_,
                              (uint6)CONCAT14(uStack_1360._2_1_,
                                              (uint)CONCAT12(uStack_1360._1_1_,
                                                             (ushort)(byte)uStack_1360)));
            uVar19 = CONCAT16(uStack_1360._7_1_,
                              (uint6)CONCAT14(uStack_1360._6_1_,
                                              (uint)CONCAT12(uStack_1360._5_1_,
                                                             (ushort)uStack_1360._4_1_)));
            auVar75 = pmovzxbw(*local_13b8,local_1368);
            local_2bf8 = auVar75._0_8_;
            uStack_2bf0 = auVar75._8_8_;
            local_15a8._2_2_ = (ushort)uStack_1360._1_1_;
            local_15a8._4_2_ = (ushort)uStack_1360._2_1_;
            local_15a8._6_2_ = (ushort)uStack_1360._3_1_;
            uStack_15a0._2_2_ = (ushort)uStack_1360._5_1_;
            uStack_15a0._4_2_ = (ushort)uStack_1360._6_1_;
            uStack_15a0._6_2_ = (ushort)uStack_1360._7_1_;
            sVar69 = (ushort)(byte)uStack_1360 * (short)local_1578;
            sVar86 = (ushort)uStack_1360._4_1_ * (short)uStack_1570;
            local_1068 = CONCAT26(local_15a8._6_2_ * local_1578._6_2_,
                                  CONCAT24(local_15a8._4_2_ * local_1578._4_2_,
                                           CONCAT22(local_15a8._2_2_ * local_1578._2_2_,sVar69)));
            uStack_1060 = CONCAT26(uStack_15a0._6_2_ * uStack_1570._6_2_,
                                   CONCAT24(uStack_15a0._4_2_ * uStack_1570._4_2_,
                                            CONCAT22(uStack_15a0._2_2_ * uStack_1570._2_2_,sVar86)))
            ;
            local_1588._0_2_ = auVar75._0_2_;
            local_1588._2_2_ = auVar75._2_2_;
            local_1588._4_2_ = auVar75._4_2_;
            local_1588._6_2_ = auVar75._6_2_;
            uStack_1580._0_2_ = auVar75._8_2_;
            uStack_1580._2_2_ = auVar75._10_2_;
            uStack_1580._4_2_ = auVar75._12_2_;
            uStack_1580._6_2_ = auVar75._14_2_;
            local_1048 = CONCAT26(local_1588._6_2_ * local_1578._6_2_,
                                  CONCAT24(local_1588._4_2_ * local_1578._4_2_,
                                           CONCAT22(local_1588._2_2_ * local_1578._2_2_,
                                                    (short)local_1588 * (short)local_1578)));
            uStack_1040 = CONCAT26(uStack_1580._6_2_ * uStack_1570._6_2_,
                                   CONCAT24(uStack_1580._4_2_ * uStack_1570._4_2_,
                                            CONCAT22(uStack_1580._2_2_ * uStack_1570._2_2_,
                                                     (short)uStack_1580 * (short)uStack_1570)));
            sVar69 = sVar69 + sVar68;
            sVar71 = local_15a8._2_2_ * local_1578._2_2_ + sVar79;
            sVar80 = local_15a8._4_2_ * local_1578._4_2_ + sVar85;
            sVar82 = local_15a8._6_2_ * local_1578._6_2_ + sVar92;
            sVar86 = sVar86 + sVar98;
            sVar88 = uStack_15a0._2_2_ * uStack_1570._2_2_ + sVar106;
            sVar93 = uStack_15a0._4_2_ * uStack_1570._4_2_ + sVar111;
            sVar95 = uStack_15a0._6_2_ * uStack_1570._6_2_ + sVar117;
            local_1228 = CONCAT26(sVar82,CONCAT24(sVar80,CONCAT22(sVar71,sVar69)));
            uStack_1220 = CONCAT26(sVar95,CONCAT24(sVar93,CONCAT22(sVar88,sVar86)));
            sVar70 = (short)local_1588 * (short)local_1578 + sVar68;
            sVar72 = local_1588._2_2_ * local_1578._2_2_ + sVar79;
            sVar81 = local_1588._4_2_ * local_1578._4_2_ + sVar85;
            sVar83 = local_1588._6_2_ * local_1578._6_2_ + sVar92;
            sVar87 = (short)uStack_1580 * (short)uStack_1570 + sVar98;
            sVar89 = uStack_1580._2_2_ * uStack_1570._2_2_ + sVar106;
            sVar94 = uStack_1580._4_2_ * uStack_1570._4_2_ + sVar111;
            sVar96 = uStack_1580._6_2_ * uStack_1570._6_2_ + sVar117;
            local_1208 = CONCAT26(sVar83,CONCAT24(sVar81,CONCAT22(sVar72,sVar70)));
            uStack_1200 = CONCAT26(sVar96,CONCAT24(sVar94,CONCAT22(sVar89,sVar87)));
            local_1a70 = s0_7 + 1;
            local_1a78 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_1238 = 0x80008000800080;
            uStack_1230 = 0x80008000800080;
            local_c68 = CONCAT26(sVar82 + 0x80,
                                 CONCAT24(sVar80 + 0x80,CONCAT22(sVar71 + 0x80,sVar69 + 0x80)));
            uStack_c60 = CONCAT26(sVar95 + 0x80,
                                  CONCAT24(sVar93 + 0x80,CONCAT22(sVar88 + 0x80,sVar86 + 0x80)));
            local_ec0 = &local_1a98;
            local_ec8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar49._8_8_ = uStack_c60;
            auVar49._0_8_ = local_c68;
            local_c78 = 0x101010101010101;
            uStack_c70 = 0x101010101010101;
            auVar31._8_8_ = 0x101010101010101;
            auVar31._0_8_ = 0x101010101010101;
            auVar75 = pmulhuw(auVar49,auVar31);
            local_2c58 = auVar75._0_8_;
            lStack_2c50 = auVar75._8_8_;
            s0_7[1] = local_2c58;
            s1_4[0] = lStack_2c50;
            local_1aa0 = s1_4 + 1;
            local_1aa8 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_1218 = 0x80008000800080;
            uStack_1210 = 0x80008000800080;
            local_c88 = CONCAT26(sVar83 + 0x80,
                                 CONCAT24(sVar81 + 0x80,CONCAT22(sVar72 + 0x80,sVar70 + 0x80)));
            uStack_c80 = CONCAT26(sVar96 + 0x80,
                                  CONCAT24(sVar94 + 0x80,CONCAT22(sVar89 + 0x80,sVar87 + 0x80)));
            local_eb0 = &local_1ac8;
            local_eb8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar48._8_8_ = uStack_c80;
            auVar48._0_8_ = local_c88;
            local_c98 = 0x101010101010101;
            uStack_c90 = 0x101010101010101;
            auVar30._8_8_ = 0x101010101010101;
            auVar30._0_8_ = 0x101010101010101;
            auVar78 = pmulhuw(auVar48,auVar30);
            local_2c78 = auVar78._0_8_;
            uStack_2c70 = auVar78._8_8_;
            local_19d8 = s1_4 + 1;
            local_19e0 = s0_7 + 1;
            local_c08._0_2_ = auVar78._0_2_;
            local_c08._2_2_ = auVar78._2_2_;
            local_c08._4_2_ = auVar78._4_2_;
            local_c08._6_2_ = auVar78._6_2_;
            uStack_c00._0_2_ = auVar78._8_2_;
            uStack_c00._2_2_ = auVar78._10_2_;
            uStack_c00._4_2_ = auVar78._12_2_;
            uStack_c00._6_2_ = auVar78._14_2_;
            local_c18._0_2_ = auVar75._0_2_;
            local_c18._2_2_ = auVar75._2_2_;
            local_c18._4_2_ = auVar75._4_2_;
            local_c18._6_2_ = auVar75._6_2_;
            uStack_c10._0_2_ = auVar75._8_2_;
            uStack_c10._2_2_ = auVar75._10_2_;
            uStack_c10._4_2_ = auVar75._12_2_;
            uStack_c10._6_2_ = auVar75._14_2_;
            local_1978 = CONCAT17((0 < uStack_c00._6_2_) * (uStack_c00._6_2_ < 0x100) * auVar78[0xe]
                                  - (0xff < uStack_c00._6_2_),
                                  CONCAT16((0 < uStack_c00._4_2_) * (uStack_c00._4_2_ < 0x100) *
                                           auVar78[0xc] - (0xff < uStack_c00._4_2_),
                                           CONCAT15((0 < uStack_c00._2_2_) *
                                                    (uStack_c00._2_2_ < 0x100) * auVar78[10] -
                                                    (0xff < uStack_c00._2_2_),
                                                    CONCAT14((0 < (short)uStack_c00) *
                                                             ((short)uStack_c00 < 0x100) *
                                                             auVar78[8] - (0xff < (short)uStack_c00)
                                                             ,CONCAT13((0 < local_c08._6_2_) *
                                                                       (local_c08._6_2_ < 0x100) *
                                                                       auVar78[6] -
                                                                       (0xff < local_c08._6_2_),
                                                                       CONCAT12((0 < local_c08._4_2_
                                                                                ) * (local_c08._4_2_
                                                                                    < 0x100) *
                                                                                auVar78[4] -
                                                                                (0xff < local_c08.
                                                                                        _4_2_),
                                                                                CONCAT11((0 < 
                                                  local_c08._2_2_) * (local_c08._2_2_ < 0x100) *
                                                  auVar78[2] - (0xff < local_c08._2_2_),
                                                  (0 < (short)local_c08) *
                                                  ((short)local_c08 < 0x100) * auVar78[0] -
                                                  (0xff < (short)local_c08))))))));
            lStack_1970 = CONCAT17((0 < uStack_c10._6_2_) * (uStack_c10._6_2_ < 0x100) *
                                   auVar75[0xe] - (0xff < uStack_c10._6_2_),
                                   CONCAT16((0 < uStack_c10._4_2_) * (uStack_c10._4_2_ < 0x100) *
                                            auVar75[0xc] - (0xff < uStack_c10._4_2_),
                                            CONCAT15((0 < uStack_c10._2_2_) *
                                                     (uStack_c10._2_2_ < 0x100) * auVar75[10] -
                                                     (0xff < uStack_c10._2_2_),
                                                     CONCAT14((0 < (short)uStack_c10) *
                                                              ((short)uStack_c10 < 0x100) *
                                                              auVar75[8] -
                                                              (0xff < (short)uStack_c10),
                                                              CONCAT13((0 < local_c18._6_2_) *
                                                                       (local_c18._6_2_ < 0x100) *
                                                                       auVar75[6] -
                                                                       (0xff < local_c18._6_2_),
                                                                       CONCAT12((0 < local_c18._4_2_
                                                                                ) * (local_c18._4_2_
                                                                                    < 0x100) *
                                                                                auVar75[4] -
                                                                                (0xff < local_c18.
                                                                                        _4_2_),
                                                                                CONCAT11((0 < 
                                                  local_c18._2_2_) * (local_c18._2_2_ < 0x100) *
                                                  auVar75[2] - (0xff < local_c18._2_2_),
                                                  (0 < (short)local_c18) *
                                                  ((short)local_c18 < 0x100) * auVar75[0] -
                                                  (0xff < (short)local_c18))))))));
            local_1960 = (longlong *)(lStack_2560 + local_2380 * 4);
            *local_1960 = local_1978;
            local_1960[1] = lStack_1970;
            local_2380 = local_2380 + 4;
            uStack_c00 = uStack_2c70;
            local_c08 = local_2c78;
            uStack_c10 = lStack_2c50;
            local_c18 = local_2c58;
            uStack_1050 = uVar20;
            local_1058 = uVar16;
            uStack_1070 = uVar20;
            local_1078 = uVar16;
            uStack_1360 = uVar2;
            uStack_1580 = uStack_2bf0;
            local_1588 = local_2bf8;
            uStack_1590 = uVar104;
            local_1598 = uVar74;
            uStack_15a0 = (ulong)uVar19;
            local_15a8 = (ulong)uVar18;
            uStack_15b0 = uVar104;
            local_15b8 = uVar74;
            local_1a80 = local_1a70;
            uStack_1a90 = uStack_c60;
            local_1a98 = local_c68;
            local_1ab0 = local_1aa0;
            uStack_1ac0 = uStack_c80;
            local_1ac8 = local_c88;
            s0_6[0] = lStack_1970;
            s1_4[1] = local_1978;
          }
          for (; local_15e8 = compositor._p32[1], uStack_15e0 = compositor._u32[0],
              local_2380 < uVar63; local_2380 = local_2380 + 1) {
            local_19a0 = (uint *)(lStack_2560 + local_2380 * 4);
            local_197c = *local_19a0;
            local_1998._4_4_ = 0;
            local_1998._0_4_ = local_197c;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = local_1998._0_8_;
            auVar75 = pmovzxbw(auVar36,local_1998._0_8_);
            local_2c98 = auVar75._0_8_;
            uStack_2c90 = auVar75._8_8_;
            local_15c8._0_2_ = auVar75._0_2_;
            local_15c8._2_2_ = auVar75._2_2_;
            local_15c8._4_2_ = auVar75._4_2_;
            local_15c8._6_2_ = auVar75._6_2_;
            uStack_15c0._0_2_ = auVar75._8_2_;
            uStack_15c0._2_2_ = auVar75._10_2_;
            uStack_15c0._4_2_ = auVar75._12_2_;
            uStack_15c0._6_2_ = auVar75._14_2_;
            local_1088 = CONCAT26(local_15c8._6_2_ * local_1578._6_2_,
                                  CONCAT24(local_15c8._4_2_ * local_1578._4_2_,
                                           CONCAT22(local_15c8._2_2_ * local_1578._2_2_,
                                                    (short)local_15c8 * (short)local_1578)));
            uStack_1080 = CONCAT26(uStack_15c0._6_2_ * uStack_1570._6_2_,
                                   CONCAT24(uStack_15c0._4_2_ * uStack_1570._4_2_,
                                            CONCAT22(uStack_15c0._2_2_ * uStack_1570._2_2_,
                                                     (short)uStack_15c0 * (short)uStack_1570)));
            sVar69 = (short)local_15c8 * (short)local_1578 + sVar68;
            sVar70 = local_15c8._2_2_ * local_1578._2_2_ + sVar79;
            sVar71 = local_15c8._4_2_ * local_1578._4_2_ + sVar85;
            sVar72 = local_15c8._6_2_ * local_1578._6_2_ + sVar92;
            sVar80 = (short)uStack_15c0 * (short)uStack_1570 + sVar98;
            sVar81 = uStack_15c0._2_2_ * uStack_1570._2_2_ + sVar106;
            sVar82 = uStack_15c0._4_2_ * uStack_1570._4_2_ + sVar111;
            sVar83 = uStack_15c0._6_2_ * uStack_1570._6_2_ + sVar117;
            local_1248 = CONCAT26(sVar72,CONCAT24(sVar71,CONCAT22(sVar70,sVar69)));
            uStack_1240 = CONCAT26(sVar83,CONCAT24(sVar82,CONCAT22(sVar81,sVar80)));
            local_1a58 = &uStack_2458;
            local_1a50 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_1258 = 0x80008000800080;
            uStack_1250 = 0x80008000800080;
            local_1a68 = CONCAT26(sVar72 + 0x80,
                                  CONCAT24(sVar71 + 0x80,CONCAT22(sVar70 + 0x80,sVar69 + 0x80)));
            uStack_1a60 = CONCAT26(sVar83 + 0x80,
                                   CONCAT24(sVar82 + 0x80,CONCAT22(sVar81 + 0x80,sVar80 + 0x80)));
            local_ed0 = &local_1a68;
            local_ed8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar50._8_8_ = uStack_1a60;
            auVar50._0_8_ = local_1a68;
            local_c58 = 0x101010101010101;
            uStack_c50 = 0x101010101010101;
            auVar32._8_8_ = 0x101010101010101;
            auVar32._0_8_ = 0x101010101010101;
            auVar75 = pmulhuw(auVar50,auVar32);
            local_2cd8 = auVar75._0_8_;
            uStack_2cd0 = auVar75._8_8_;
            local_19c8 = &uStack_2458;
            local_19d0 = &uStack_2458;
            local_c38 = local_2cd8;
            uStack_c30 = uStack_2cd0;
            local_c28._0_2_ = auVar75._0_2_;
            local_c28._2_2_ = auVar75._2_2_;
            local_c28._4_2_ = auVar75._4_2_;
            local_c28._6_2_ = auVar75._6_2_;
            uStack_c20._0_2_ = auVar75._8_2_;
            uStack_c20._2_2_ = auVar75._10_2_;
            uStack_c20._4_2_ = auVar75._12_2_;
            uStack_c20._6_2_ = auVar75._14_2_;
            uVar17 = CONCAT13((0 < local_c28._6_2_) * (local_c28._6_2_ < 0x100) * auVar75[6] -
                              (0xff < local_c28._6_2_),
                              CONCAT12((0 < local_c28._4_2_) * (local_c28._4_2_ < 0x100) *
                                       auVar75[4] - (0xff < local_c28._4_2_),
                                       CONCAT11((0 < local_c28._2_2_) * (local_c28._2_2_ < 0x100) *
                                                auVar75[2] - (0xff < local_c28._2_2_),
                                                (0 < (short)local_c28) * ((short)local_c28 < 0x100)
                                                * auVar75[0] - (0xff < (short)local_c28))));
            uStack_2458 = CONCAT17((0 < uStack_c20._6_2_) * (uStack_c20._6_2_ < 0x100) *
                                   auVar75[0xe] - (0xff < uStack_c20._6_2_),
                                   CONCAT16((0 < uStack_c20._4_2_) * (uStack_c20._4_2_ < 0x100) *
                                            auVar75[0xc] - (0xff < uStack_c20._4_2_),
                                            CONCAT15((0 < uStack_c20._2_2_) *
                                                     (uStack_c20._2_2_ < 0x100) * auVar75[10] -
                                                     (0xff < uStack_c20._2_2_),
                                                     CONCAT14((0 < (short)uStack_c20) *
                                                              ((short)uStack_c20 < 0x100) *
                                                              auVar75[8] -
                                                              (0xff < (short)uStack_c20),uVar17))));
            s0_7[0] = CONCAT17((0 < uStack_c20._6_2_) * (uStack_c20._6_2_ < 0x100) * auVar75[0xe] -
                               (0xff < uStack_c20._6_2_),
                               CONCAT16((0 < uStack_c20._4_2_) * (uStack_c20._4_2_ < 0x100) *
                                        auVar75[0xc] - (0xff < uStack_c20._4_2_),
                                        CONCAT15((0 < uStack_c20._2_2_) * (uStack_c20._2_2_ < 0x100)
                                                 * auVar75[10] - (0xff < uStack_c20._2_2_),
                                                 CONCAT14((0 < (short)uStack_c20) *
                                                          ((short)uStack_c20 < 0x100) * auVar75[8] -
                                                          (0xff < (short)uStack_c20),
                                                          CONCAT13((0 < local_c28._6_2_) *
                                                                   (local_c28._6_2_ < 0x100) *
                                                                   auVar75[6] -
                                                                   (0xff < local_c28._6_2_),
                                                                   CONCAT12((0 < local_c28._4_2_) *
                                                                            (local_c28._4_2_ < 0x100
                                                                            ) * auVar75[4] -
                                                                            (0xff < local_c28._4_2_)
                                                                            ,CONCAT11((0 < local_c28
                                                  ._2_2_) * (local_c28._2_2_ < 0x100) * auVar75[2] -
                                                  (0xff < local_c28._2_2_),
                                                  (0 < (short)local_c28) *
                                                  ((short)local_c28 < 0x100) * auVar75[0] -
                                                  (0xff < (short)local_c28))))))));
            *(undefined4 *)(lStack_2560 + local_2380 * 4) = uVar17;
            local_1a48 = local_1a58;
            local_1998 = ZEXT416(local_197c);
            local_1678 = uStack_2458;
            lStack_1670 = s0_7[0];
            local_1668 = uStack_2458;
            lStack_1660 = s0_7[0];
            local_15d8 = uVar74;
            uStack_15d0 = uVar104;
            local_15c8 = local_2c98;
            uStack_15c0 = uStack_2c90;
            local_1098 = uVar16;
            uStack_1090 = uVar20;
            local_c48 = local_1a68;
            uStack_c40 = uStack_1a60;
            local_c28 = local_2cd8;
            uStack_c20 = uStack_2cd0;
          }
        }
      }
    }
    uStack_1570 = uVar105;
    local_1578 = uVar58;
    dstStride = iVar61 + dstStride;
    compositor._u32[1] = *(long *)(this + 0x58) * 8 + compositor._u32[1];
    y1 = y1 + 1;
    cell = (Cell *)0x0;
  } while( true );
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}